

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx::forward
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  void *__ptr;
  undefined4 uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  Option *pOVar19;
  int *piVar20;
  undefined1 (*pauVar21) [32];
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  int iVar24;
  undefined4 uVar25;
  uint uVar26;
  ulong uVar27;
  Mat *pMVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  float *pfVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  Layer *pLVar37;
  size_t sVar38;
  Option *pOVar39;
  int iVar40;
  ulong uVar41;
  float *pfVar42;
  long lVar43;
  float *pfVar44;
  undefined1 (*pauVar45) [32];
  bool bVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  uint uVar50;
  int iVar51;
  undefined1 (*pauVar52) [32];
  uint uVar53;
  int iVar54;
  undefined4 *puVar55;
  undefined1 (*pauVar56) [32];
  float fVar57;
  float sum1 [4];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  float sum0 [4];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  ulong uVar179;
  ulong uVar180;
  undefined8 in_stack_fffffffffffffd98;
  Mat local_228;
  float *local_1d8;
  Mat *local_1d0;
  ulong local_1c8;
  uint local_1bc;
  ulong local_1b8;
  ulong local_1b0;
  int local_1a4;
  int TILE_N;
  int TILE_M;
  ulong local_198;
  long local_190;
  Mat local_188;
  ulong local_138;
  long local_130;
  long local_128;
  uint local_120;
  int TILE_K;
  Mat local_118;
  Option *local_d0;
  Option *local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  undefined1 (*local_98) [32];
  size_t local_90;
  ulong local_88;
  long local_80;
  long local_78;
  ulong local_70;
  long local_68;
  int local_60;
  uint local_5c;
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  auVar58 = in_ZMM2._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).int8_scale_term != 0)) {
    iVar14 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar14;
  }
  iVar14 = (this->super_Convolution).kernel_w;
  iVar49 = (this->super_Convolution).kernel_h;
  if (iVar49 != 1 || (iVar14 != 1 || bottom_blob->dims != 1)) {
    pOVar19 = (Option *)CONCAT44((int)((ulong)in_stack_fffffffffffffd98 >> 0x20),bottom_blob->c);
    iVar51 = (this->super_Convolution).dilation_w;
    uVar41 = bottom_blob->elemsize;
    iVar40 = (this->super_Convolution).dilation_h;
    iVar34 = bottom_blob->elempack;
    local_228.cstep = 0;
    local_228.data = (void *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Convolution::make_padding(&this->super_Convolution,bottom_blob,&local_228,opt);
    iVar29 = local_228.h;
    iVar54 = local_228.w;
    if ((local_228.data == (void *)0x0) || ((long)local_228.c * local_228.cstep == 0)) {
      iVar14 = -100;
    }
    else {
      iVar51 = (~((iVar14 + -1) * iVar51) + local_228.w) / (this->super_Convolution).stride_w + 1;
      iVar49 = (~((iVar49 + -1) * iVar40) + local_228.h) / (this->super_Convolution).stride_h + 1;
      auVar98._4_4_ = (this->super_Convolution).num_output;
      lVar36 = 1;
      if (opt->use_packing_layout == true) {
        lVar36 = 8;
        if ((auVar98._4_4_ & 7) != 0) {
          lVar36 = (ulong)((auVar98._4_4_ & 3) == 0) * 3 + 1;
        }
      }
      iVar40 = (int)lVar36;
      sVar38 = lVar36 * (uVar41 / (ulong)(long)iVar34);
      Mat::create(top_blob,iVar51,iVar49,(int)auVar98._4_4_ / iVar40,sVar38,iVar40,
                  opt->blob_allocator);
      uVar25 = (undefined4)(sVar38 >> 0x20);
      iVar14 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (((opt->use_packing_layout == false) &&
            ((((((this->super_Convolution).kernel_w == (this->super_Convolution).kernel_h &&
                (iVar14 = (this->super_Convolution).dilation_w, iVar14 != 1)) &&
               (iVar33 = (this->super_Convolution).dilation_h, iVar33 == iVar14)) &&
              (((this->super_Convolution).stride_w == 1 && ((this->super_Convolution).stride_h == 1)
               ))) && (iVar14 <= iVar51)))) && (iVar33 <= iVar49)) {
          iVar14 = forwardDilation_x86(this,&local_228,top_blob,opt);
        }
        else {
          iVar14 = (int)pOVar19 * iVar34;
          bVar13 = opt->use_winograd23_convolution;
          if (((bVar13 == false) && (opt->use_winograd43_convolution == false)) &&
             (opt->use_winograd63_convolution != true)) {
            bVar11 = false;
          }
          else {
            bVar11 = true;
            if (iVar14 < 9) {
              bVar11 = 8 < (this->super_Convolution).num_output;
            }
          }
          auVar83._0_4_ = (this->super_Convolution).kernel_w;
          auVar83._4_4_ = (this->super_Convolution).kernel_h;
          auVar83._8_4_ = (this->super_Convolution).dilation_w;
          auVar83._12_4_ = (this->super_Convolution).dilation_h;
          local_1d0 = top_blob;
          if ((((auVar83 == _DAT_005a6800) && ((this->super_Convolution).stride_w == 1)) &&
              ((this->super_Convolution).stride_h == 1)) &&
             ((opt->use_winograd_convolution != false && (bVar11)))) {
            iVar49 = (this->super_Convolution).num_output;
            bVar11 = test_prefer_winograd63(iVar14,iVar49,iVar54,iVar29);
            bVar12 = test_prefer_winograd23(iVar14,iVar49,iVar54,iVar29);
            if ((bVar12) &&
               (((bVar13 == false || ((this->weight_winograd23_data).data == (void *)0x0)) ||
                ((long)(this->weight_winograd23_data).c * (this->weight_winograd23_data).cstep == 0)
                ))) {
              bVar13 = true;
              bVar12 = false;
              bVar10 = false;
              if (bVar11) {
LAB_002022b2:
                bVar10 = false;
                if (((opt->use_winograd63_convolution != true) ||
                    ((this->weight_winograd63_data).data == (void *)0x0)) ||
                   (bVar11 = (long)(this->weight_winograd63_data).c *
                             (this->weight_winograd63_data).cstep == 0, bVar10 = !bVar11,
                   bVar13 || bVar11)) goto LAB_002022f8;
LAB_00202361:
                bVar46 = true;
              }
              else {
LAB_002022f8:
                bVar46 = bVar10;
                if (((opt->use_winograd43_convolution == true) &&
                    ((this->weight_winograd43_data).data != (void *)0x0)) &&
                   (bVar13 = true,
                   (long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep !=
                   0)) goto LAB_0020236b;
                if (((opt->use_winograd63_convolution == true) &&
                    ((this->weight_winograd63_data).data != (void *)0x0)) &&
                   ((long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep !=
                    0)) goto LAB_00202361;
                bVar12 = true;
              }
              bVar13 = false;
            }
            else {
              if (bVar11) {
                bVar13 = !bVar12 && !bVar11;
                goto LAB_002022b2;
              }
              bVar46 = false;
              bVar13 = false;
              bVar10 = false;
              if (!bVar12 && !bVar11) goto LAB_002022f8;
            }
LAB_0020236b:
            iVar14 = this->nT;
            iVar49 = iVar14;
            if (iVar14 == 0) {
              iVar49 = opt->num_threads;
            }
            if (opt->num_threads != iVar14 && iVar14 != 0) {
              forward();
            }
            pMVar28 = local_1d0;
            if (bVar12 == false) {
              if (bVar13) {
                iVar14 = conv3x3s1_winograd43
                                   (&local_228,local_1d0,&this->weight_winograd43_data,
                                    &(this->super_Convolution).bias_data,iVar49,opt);
                goto LAB_002048ba;
              }
              if (bVar46) {
                iVar14 = conv3x3s1_winograd63
                                   (&local_228,local_1d0,&this->weight_winograd63_data,
                                    &(this->super_Convolution).bias_data,iVar49,opt);
                goto LAB_002048ba;
              }
            }
            else {
              iVar14 = conv3x3s1_winograd23
                                 (&local_228,local_1d0,&this->weight_winograd23_data,
                                  &(this->super_Convolution).bias_data,iVar49,opt);
LAB_002048ba:
              if (iVar14 != 0) goto LAB_00200ec3;
            }
            pLVar37 = this->activation;
            iVar14 = 0;
            if (pLVar37 != (Layer *)0x0) {
              (*pLVar37->_vptr_Layer[9])(pLVar37,pMVar28,opt);
            }
          }
          else {
            iVar51 = get_cpu_level2_cache_size();
            pMVar28 = local_1d0;
            iVar49 = (this->super_Convolution).num_output;
            auVar98._0_4_ = (this->super_Convolution).kernel_w;
            auVar98._4_4_ = (this->super_Convolution).kernel_h;
            auVar98._8_4_ = (this->super_Convolution).dilation_w;
            auVar98._12_4_ = (this->super_Convolution).dilation_h;
            uVar17 = (this->super_Convolution).stride_w;
            uVar50 = (this->super_Convolution).stride_h;
            pOVar39 = (Option *)CONCAT44(uVar25,auVar98._0_4_);
            uVar41 = (ulong)(uint)auVar98._8_4_;
            if ((opt->use_sgemm_convolution != true) ||
               ((int)(auVar98._0_4_ * auVar98._4_4_ * auVar98._12_4_ * uVar50 *
                      iVar14 * iVar49 * auVar98._8_4_ * uVar17 * 8) <= iVar51 &&
                (iVar14 < 0x11 && iVar49 < 0x11))) {
              auVar82._8_4_ = 1;
              auVar82._0_8_ = 0x100000001;
              auVar82._12_4_ = 1;
              auVar83 = vpcmpeqd_avx(auVar98,auVar82);
              auVar83 = vpmovsxdq_avx(auVar83);
              auVar58 = vpcmpeqd_avx(auVar58,auVar58);
              if (((auVar58 & ~auVar83) >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  SUB161(auVar58 & ~auVar83,0xf) < '\0') {
                if ((iVar34 == 8) && (iVar40 == 8)) {
                  if ((uVar50 == 1 && uVar17 == 1) && auVar98 == _DAT_005a6800) {
                    conv3x3s1_pack8_avx(&local_228,local_1d0,&this->weight_data_tm,
                                        (Mat *)(this->super_Convolution).bias_data.data,pOVar39);
                    goto LAB_00204f9e;
                  }
                  auVar58 = vpcmpeqd_avx(auVar98,_DAT_005a6800);
                  uVar25 = vmovmskps_avx(auVar58);
                  bVar13 = false;
                  iVar14 = 0;
                  if (((((auVar98._4_4_ == 2 && auVar98._0_4_ == 2) && uVar17 == 1) && uVar50 == 1)
                      & (byte)uVar25 >> 2 & (byte)uVar25 >> 3) != 1) goto LAB_00204ea4;
                  local_1b8 = uVar41;
                  conv2x2s1_pack8_avx(&local_228,local_1d0,&this->weight_data_tm,
                                      (Mat *)(this->super_Convolution).bias_data.data,pOVar39);
                  pLVar37 = this->activation;
                  if (pLVar37 == (Layer *)0x0) goto LAB_00200ec3;
LAB_00204faa:
                  (*pLVar37->_vptr_Layer[9])(pLVar37,pMVar28,opt);
                }
                else {
                  bVar13 = iVar34 == 1;
                  if ((bVar13) && (iVar40 == 8)) {
                    auVar58 = vpcmpeqd_avx(auVar98,_DAT_005a6800);
                    uVar26 = vmovmskps_avx(auVar58);
                    if (uVar50 == 1 && (uVar17 == 1 && (uVar26 ^ 0xf) == 0)) {
                      local_1b8 = uVar41;
                      conv3x3s1_pack1to8_avx
                                (&local_228,local_1d0,&this->weight_data_tm,
                                 (Mat *)(this->super_Convolution).bias_data.data,pOVar39);
                    }
                    else {
                      bVar13 = true;
                      if ((uVar50 != 2 || uVar17 != 2) || (char)(uVar26 ^ 0xf) != '\0')
                      goto LAB_00204ea4;
                      local_1b8 = uVar41;
                      conv3x3s2_pack1to8_avx
                                (&local_228,local_1d0,&this->weight_data_tm,
                                 (Mat *)(this->super_Convolution).bias_data.data,pOVar39);
                    }
LAB_00204f9e:
                    pLVar37 = this->activation;
                    if (pLVar37 != (Layer *)0x0) goto LAB_00204faa;
                  }
                  else {
LAB_00204ea4:
                    uVar26 = auVar98._8_4_ ^ 1;
                    uVar53 = auVar98._12_4_ ^ 1;
                    if (uVar50 == 1 &&
                        (uVar17 == 1 &&
                        ((uVar26 == 0 && uVar53 == 0) &&
                        (((iVar40 == 1 && iVar34 == 8) && (auVar98._0_4_ ^ 3) == 0) &&
                        (auVar98._4_4_ ^ 3) == 0)))) {
                      local_1b8 = uVar41;
                      conv3x3s1_pack8to1_avx
                                (&local_228,local_1d0,&this->weight_data_tm,
                                 (Mat *)(this->super_Convolution).bias_data.data,pOVar39);
                      goto LAB_00204f9e;
                    }
                    if (bVar13 && iVar40 == 4) {
                      bVar13 = (auVar98._0_4_ ^ 3) != 0 || (auVar98._4_4_ ^ 3) != 0;
                      if ((uVar17 != 1 || uVar50 != 1) || ((bVar13 || uVar26 != 0) || uVar53 != 0))
                      {
                        if (((bVar13 || uVar26 != 0) || uVar53 != 0) || (uVar50 != 2 || uVar17 != 2)
                           ) goto LAB_00204fba;
                        local_1b8 = uVar41;
                        conv3x3s2_pack1to4_sse
                                  (&local_228,local_1d0,&this->weight_data_tm,
                                   (Mat *)(this->super_Convolution).bias_data.data,pOVar39);
                      }
                      else {
                        local_1b8 = uVar41;
                        conv3x3s1_pack1to4_sse
                                  (&local_228,local_1d0,&this->weight_data_tm,
                                   (Mat *)(this->super_Convolution).bias_data.data,pOVar39);
                      }
                      goto LAB_00204f9e;
                    }
LAB_00204fba:
                    local_1b8 = uVar41;
                    convolution_packed(&local_228,local_1d0,&this->weight_data_tm,
                                       &(this->super_Convolution).bias_data,auVar98._0_4_,
                                       auVar98._4_4_,auVar98._8_4_,auVar98._12_4_,uVar17,uVar50,
                                       (this->super_Convolution).activation_type,
                                       &(this->super_Convolution).activation_params,pOVar19);
                  }
                }
                iVar14 = 0;
                goto LAB_00200ec3;
              }
            }
            uVar26 = this->nT;
            uVar53 = uVar26;
            if (uVar26 == 0) {
              uVar53 = opt->num_threads;
            }
            if (opt->num_threads != uVar26 && uVar26 != 0) {
              fprintf(_stderr,
                      "opt.num_threads %d changed, convolution gemm will use load-time value %d");
              fputc(10,_stderr);
              pOVar39 = (Option *)(ulong)(uint)(this->super_Convolution).kernel_w;
              auVar98._4_4_ = (this->super_Convolution).kernel_h;
              uVar41 = (ulong)(uint)(this->super_Convolution).dilation_w;
              auVar98._12_4_ = (this->super_Convolution).dilation_h;
              uVar17 = (this->super_Convolution).stride_w;
              uVar50 = (this->super_Convolution).stride_h;
            }
            local_b8 = (ulong)uVar50;
            local_c0 = (ulong)auVar98._12_4_;
            local_b0 = (ulong)uVar17;
            local_d0 = (Option *)(ulong)auVar98._4_4_;
            uVar50 = pMVar28->elempack * pMVar28->c;
            uVar23 = (ulong)uVar50;
            auVar98._12_4_ = pMVar28->h * pMVar28->w;
            uVar30 = (ulong)auVar98._12_4_;
            auVar98._4_4_ = auVar98._4_4_ * (int)pOVar39 * local_228.c * local_228.elempack;
            uVar27 = (ulong)auVar98._4_4_;
            local_1b8 = uVar41;
            local_138 = (ulong)uVar53;
            local_c8 = pOVar39;
            convolution_im2col_gemm_get_optimal_tile_mnk
                      (uVar50,auVar98._12_4_,auVar98._4_4_,&TILE_M,&TILE_N,&TILE_K,uVar53);
            uVar17 = TILE_N;
            local_70 = (ulong)(uint)TILE_M;
            local_120 = (int)(TILE_M + uVar50 + -1) / TILE_M;
            iVar49 = (int)(auVar98._12_4_ + TILE_N + -1) / TILE_N;
            local_1b0 = (ulong)(uint)TILE_K;
            iVar14 = ((int)uVar27 + TILE_K + -1) / TILE_K;
            local_188.cstep = 0;
            local_188.data = (void *)0x0;
            local_188.refcount._0_4_ = 0;
            local_188.refcount._4_4_ = 0;
            local_188.elemsize = 0;
            local_188.elempack = 0;
            local_188.allocator = (Allocator *)0x0;
            local_188.dims = 0;
            local_188.w = 0;
            local_188.h = 0;
            local_188.d = 0;
            local_188.c = 0;
            local_1c8 = CONCAT44(local_1c8._4_4_,iVar14);
            Mat::create(&local_188,TILE_K * TILE_N,iVar14,iVar49,4,opt->workspace_allocator);
            iVar14 = -100;
            local_a0 = uVar30;
            if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
              iVar49 = iVar49 * (int)local_1c8;
              local_1d8 = (float *)CONCAT44(local_1d8._4_4_,iVar49);
              local_198 = uVar23;
              if (0 < iVar49) {
                iVar14 = (int)local_c8;
                iVar49 = (int)local_d0;
                bVar12 = iVar49 == 1 && iVar14 == 1;
                bVar13 = (int)local_c0 == 1 && (int)local_1b8 == 1;
                bVar46 = (int)local_b8 == 1 && (int)local_b0 == 1;
                local_190 = CONCAT71(local_190._1_7_,(bVar12 && bVar13) && bVar46);
                bVar11 = (int)local_b8 == 2 && (int)local_b0 == 2;
                local_128 = CONCAT71(local_128._1_7_,bVar12 && bVar11);
                bVar12 = (iVar49 == 3 && iVar14 == 3) && bVar13;
                local_130 = CONCAT71(local_130._1_7_,bVar12 && bVar46);
                local_68 = CONCAT71(local_68._1_7_,bVar12 && bVar11);
                bVar12 = (iVar49 == 5 && iVar14 == 5) && bVar13;
                local_78 = CONCAT71(local_78._1_7_,bVar46 && bVar12);
                local_80 = CONCAT71(local_80._1_7_,bVar12 && bVar11);
                local_88 = CONCAT71(local_88._1_7_,
                                    ((iVar49 == 7 && iVar14 == 7) && bVar13) && bVar11);
                iVar14 = 0;
                do {
                  iVar49 = (iVar14 / (int)local_1c8) * uVar17;
                  iVar51 = (int)((long)iVar14 % (long)(int)local_1c8) * (int)local_1b0;
                  uVar50 = (int)local_a0 - iVar49;
                  if ((int)uVar17 < (int)uVar50) {
                    uVar50 = uVar17;
                  }
                  auVar98._4_4_ = (int)uVar27 - iVar51;
                  uVar41 = (ulong)auVar98._4_4_;
                  if ((int)local_1b0 < (int)auVar98._4_4_) {
                    uVar41 = local_1b0 & 0xffffffff;
                  }
                  pMVar28 = (Mat *)((long)local_188.data +
                                   ((long)iVar14 % (long)(int)local_1c8 & 0xffffffffU) *
                                   (long)local_188.w * local_188.elemsize +
                                   (long)(iVar14 / (int)local_1c8) * local_188.cstep *
                                   local_188.elemsize);
                  iVar40 = (int)uVar41;
                  if ((char)local_190 == '\0') {
                    if ((char)local_128 == '\0') {
                      if ((char)local_130 != '\0') {
                        uVar30 = 1;
                        uVar41 = 1;
LAB_002021c1:
                        pOVar19 = (Option *)0x3;
                        goto LAB_002021c8;
                      }
                      if ((char)local_68 != '\0') {
                        uVar30 = 2;
                        uVar41 = 2;
                        goto LAB_002021c1;
                      }
                      if ((char)local_78 != '\0') {
                        uVar30 = 1;
                        uVar41 = 1;
LAB_00202236:
                        pOVar19 = (Option *)0x5;
                        goto LAB_002021c8;
                      }
                      if ((char)local_80 != '\0') {
                        uVar30 = 2;
                        uVar41 = 2;
                        goto LAB_00202236;
                      }
                      pOVar19 = local_c8;
                      pOVar39 = local_d0;
                      uVar179 = local_1b8;
                      uVar180 = local_c0;
                      uVar41 = local_b0;
                      uVar30 = local_b8;
                      if ((char)local_88 != '\0') {
                        uVar30 = 2;
                        uVar41 = 2;
                        pOVar19 = (Option *)0x7;
                        goto LAB_002021c8;
                      }
                    }
                    else {
                      uVar30 = 2;
                      uVar41 = 2;
                      pOVar19 = (Option *)0x1;
LAB_002021c8:
                      pOVar39 = pOVar19;
                      uVar179 = 1;
                      uVar180 = 1;
                    }
                    convolution_im2col_input_tile_impl
                              (&local_228,pMVar28,iVar49,uVar50,iVar51,iVar40,(int)pOVar19,
                               (int)pOVar39,(int)uVar179,(int)uVar180,(int)uVar41,(int)uVar30);
                  }
                  else {
                    lVar36 = 0;
                    lVar31 = (long)iVar51;
                    lVar18 = (long)iVar49;
                    if (0xb < (int)uVar50) {
                      iVar49 = iVar40 + 3;
                      if (-1 < iVar40) {
                        iVar49 = iVar40;
                      }
                      iVar34 = iVar40 + 7;
                      if (-1 < iVar40) {
                        iVar34 = iVar40;
                      }
                      iVar29 = iVar51 + 3;
                      iVar54 = iVar51 + 7;
                      if (-1 < iVar51) {
                        iVar29 = iVar51;
                        iVar54 = iVar51;
                      }
                      lVar43 = 0;
                      do {
                        if (local_228.elempack == 8) {
                          if (7 < iVar40) {
                            pauVar21 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       (lVar43 + lVar18) * 0x20 +
                                       local_228.cstep * (long)(iVar54 >> 3) * local_228.elemsize);
                            iVar33 = iVar34 >> 3;
                            do {
                              auVar76 = vunpcklps_avx(*pauVar21,pauVar21[1]);
                              auVar93 = vunpckhps_avx(*pauVar21,pauVar21[1]);
                              auVar174 = vunpcklps_avx(pauVar21[2],pauVar21[3]);
                              auVar107 = vunpckhps_avx(pauVar21[2],pauVar21[3]);
                              auVar163 = vunpcklps_avx(pauVar21[4],pauVar21[5]);
                              auVar119 = vunpckhps_avx(pauVar21[4],pauVar21[5]);
                              auVar153 = vunpcklps_avx(pauVar21[6],pauVar21[7]);
                              auVar127 = vunpckhps_avx(pauVar21[6],pauVar21[7]);
                              auVar157 = vunpcklps_avx(pauVar21[8],pauVar21[9]);
                              auVar134 = vunpckhps_avx(pauVar21[8],pauVar21[9]);
                              auVar164 = vunpcklps_avx(pauVar21[10],pauVar21[0xb]);
                              auVar142 = vunpckhps_avx(pauVar21[10],pauVar21[0xb]);
                              auVar148 = vunpcklpd_avx(auVar76,auVar174);
                              auVar76 = vunpckhpd_avx(auVar76,auVar174);
                              auVar174 = vunpcklpd_avx(auVar93,auVar107);
                              auVar93 = vunpckhpd_avx(auVar93,auVar107);
                              auVar141 = vunpcklpd_avx(auVar163,auVar153);
                              auVar107 = vunpckhpd_avx(auVar163,auVar153);
                              auVar163 = vunpcklpd_avx(auVar119,auVar127);
                              auVar119 = vunpckhpd_avx(auVar119,auVar127);
                              auVar153 = vunpcklpd_avx(auVar157,auVar164);
                              auVar127 = vunpckhpd_avx(auVar157,auVar164);
                              auVar157 = vunpcklpd_avx(auVar134,auVar142);
                              auVar134 = vunpckhpd_avx(auVar134,auVar142);
                              auVar83 = auVar141._0_16_;
                              auVar142 = vperm2f128_avx(auVar148,auVar141,0x31);
                              auVar84 = auVar153._0_16_;
                              auVar58 = auVar76._0_16_;
                              auVar76 = vperm2f128_avx(auVar153,auVar76,0x31);
                              auVar141._16_16_ = auVar127._0_16_;
                              auVar141._0_16_ = auVar107._0_16_;
                              auVar107 = vperm2f128_avx(auVar107,auVar127,0x31);
                              auVar113 = auVar174._0_16_;
                              auVar82 = auVar163._0_16_;
                              auVar127 = vperm2f128_avx(auVar174,auVar163,0x31);
                              auVar174._16_16_ = auVar93._0_16_;
                              auVar174._0_16_ = auVar157._0_16_;
                              auVar93 = vperm2f128_avx(auVar157,auVar93,0x31);
                              auVar98 = auVar119._0_16_;
                              auVar99 = auVar134._0_16_;
                              auVar119 = vperm2f128_avx(auVar119,auVar134,0x31);
                              pMVar28->data = (void *)SUB168(auVar148._0_16_,0);
                              pMVar28->refcount = (int *)SUB168(auVar148._0_16_,8);
                              pMVar28->elemsize = auVar83._0_8_;
                              pMVar28->elempack = auVar83._8_4_;
                              *(int *)&pMVar28->field_0x1c = auVar83._12_4_;
                              pMVar28->allocator = (Allocator *)auVar84._0_8_;
                              pMVar28->dims = auVar84._8_4_;
                              pMVar28->w = auVar84._12_4_;
                              pMVar28->h = auVar58._0_4_;
                              pMVar28->d = auVar58._4_4_;
                              pMVar28->c = auVar58._8_4_;
                              *(int *)&pMVar28->field_0x3c = auVar58._12_4_;
                              *(undefined1 (*) [32])&pMVar28->cstep = auVar141;
                              pMVar28[1].elempack = auVar113._0_4_;
                              *(int *)&pMVar28[1].field_0x1c = auVar113._4_4_;
                              pMVar28[1].allocator = (Allocator *)auVar113._8_8_;
                              pMVar28[1].dims = auVar82._0_4_;
                              pMVar28[1].w = auVar82._4_4_;
                              pMVar28[1].h = auVar82._8_4_;
                              pMVar28[1].d = auVar82._12_4_;
                              *(undefined1 (*) [32])&pMVar28[1].c = auVar174;
                              pMVar28[2].elemsize = auVar98._0_8_;
                              pMVar28[2].elempack = auVar98._8_4_;
                              *(int *)&pMVar28[2].field_0x1c = auVar98._12_4_;
                              pMVar28[2].allocator = (Allocator *)auVar99._0_8_;
                              pMVar28[2].dims = auVar99._8_4_;
                              pMVar28[2].w = auVar99._12_4_;
                              *(undefined1 (*) [32])&pMVar28[2].h = auVar142;
                              pMVar28[3].refcount = (int *)auVar76._0_8_;
                              pMVar28[3].elemsize = auVar76._8_8_;
                              pMVar28[3].elempack = auVar76._16_4_;
                              *(int *)&pMVar28[3].field_0x1c = auVar76._20_4_;
                              pMVar28[3].allocator = (Allocator *)auVar76._24_8_;
                              pMVar28[3].dims = auVar107._0_4_;
                              pMVar28[3].w = auVar107._4_4_;
                              pMVar28[3].h = auVar107._8_4_;
                              pMVar28[3].d = auVar107._12_4_;
                              pMVar28[3].c = auVar107._16_4_;
                              *(int *)&pMVar28[3].field_0x3c = auVar107._20_4_;
                              pMVar28[3].cstep = auVar107._24_8_;
                              pMVar28[4].data = (void *)auVar127._0_8_;
                              pMVar28[4].refcount = (int *)auVar127._8_8_;
                              pMVar28[4].elemsize = auVar127._16_8_;
                              pMVar28[4].elempack = auVar127._24_4_;
                              *(int *)&pMVar28[4].field_0x1c = auVar127._28_4_;
                              pMVar28[4].allocator = (Allocator *)auVar93._0_8_;
                              pMVar28[4].dims = auVar93._8_4_;
                              pMVar28[4].w = auVar93._12_4_;
                              pMVar28[4].h = auVar93._16_4_;
                              pMVar28[4].d = auVar93._20_4_;
                              pMVar28[4].c = auVar93._24_4_;
                              *(int *)&pMVar28[4].field_0x3c = auVar93._28_4_;
                              *(undefined1 (*) [32])&pMVar28[4].cstep = auVar119;
                              pMVar28 = (Mat *)&pMVar28[5].elempack;
                              pauVar21 = pauVar21 + local_228.cstep;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                            goto LAB_00201769;
                          }
                        }
                        else {
LAB_00201769:
                          if (local_228.elempack == 4) {
                            if (iVar40 < 4) goto LAB_00201908;
                            pauVar22 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       (lVar43 + lVar18) * 0x10 +
                                       local_228.cstep * (long)(iVar29 >> 2) * local_228.elemsize);
                            iVar33 = iVar49 >> 2;
                            do {
                              auVar98 = vpunpckldq_avx(*pauVar22,pauVar22[1]);
                              auVar82 = vpunpckldq_avx(pauVar22[2],pauVar22[3]);
                              auVar58 = vpunpckhdq_avx(*pauVar22,pauVar22[1]);
                              auVar83 = vpunpckhdq_avx(pauVar22[2],pauVar22[3]);
                              auVar84 = vpunpcklqdq_avx(auVar98,auVar82);
                              auVar98 = vpunpckhqdq_avx(auVar98,auVar82);
                              auVar82 = vpunpcklqdq_avx(auVar58,auVar83);
                              auVar58 = vpunpckhqdq_avx(auVar58,auVar83);
                              auVar83 = vunpcklps_avx(pauVar22[4],pauVar22[5]);
                              auVar124 = vunpcklps_avx(pauVar22[6],pauVar22[7]);
                              auVar99 = vunpckhps_avx(pauVar22[4],pauVar22[5]);
                              auVar113 = vunpckhps_avx(pauVar22[6],pauVar22[7]);
                              auVar139 = vunpcklpd_avx(auVar83,auVar124);
                              auVar83 = vunpckhpd_avx(auVar83,auVar124);
                              auVar146 = vunpcklpd_avx(auVar99,auVar113);
                              auVar99 = vunpckhpd_avx(auVar99,auVar113);
                              auVar113 = vunpcklps_avx(pauVar22[8],pauVar22[9]);
                              auVar156 = vunpcklps_avx(pauVar22[10],pauVar22[0xb]);
                              auVar124 = vunpckhps_avx(pauVar22[8],pauVar22[9]);
                              auVar131 = vunpckhps_avx(pauVar22[10],pauVar22[0xb]);
                              auVar152 = vunpcklpd_avx(auVar113,auVar156);
                              auVar113 = vunpckhpd_avx(auVar113,auVar156);
                              auVar156 = vunpcklpd_avx(auVar124,auVar131);
                              auVar124 = vunpckhpd_avx(auVar124,auVar131);
                              pMVar28->data = (void *)auVar84._0_8_;
                              pMVar28->refcount = (int *)auVar84._8_8_;
                              pMVar28->elemsize = auVar139._0_8_;
                              pMVar28->elempack = auVar139._8_4_;
                              *(int *)&pMVar28->field_0x1c = auVar139._12_4_;
                              pMVar28->allocator = (Allocator *)auVar152._0_8_;
                              pMVar28->dims = auVar152._8_4_;
                              pMVar28->w = auVar152._12_4_;
                              pMVar28->h = auVar98._0_4_;
                              pMVar28->d = auVar98._4_4_;
                              pMVar28->c = auVar98._8_4_;
                              *(int *)&pMVar28->field_0x3c = auVar98._12_4_;
                              *(undefined1 (*) [16])&pMVar28->cstep = auVar83;
                              pMVar28[1].refcount = (int *)auVar113._0_8_;
                              pMVar28[1].elemsize = auVar113._8_8_;
                              pMVar28[1].elempack = auVar82._0_4_;
                              *(int *)&pMVar28[1].field_0x1c = auVar82._4_4_;
                              pMVar28[1].allocator = (Allocator *)auVar82._8_8_;
                              pMVar28[1].dims = auVar146._0_4_;
                              pMVar28[1].w = auVar146._4_4_;
                              pMVar28[1].h = auVar146._8_4_;
                              pMVar28[1].d = auVar146._12_4_;
                              pMVar28[1].c = auVar156._0_4_;
                              *(int *)&pMVar28[1].field_0x3c = auVar156._4_4_;
                              pMVar28[1].cstep = auVar156._8_8_;
                              pMVar28[2].data = (void *)auVar58._0_8_;
                              pMVar28[2].refcount = (int *)auVar58._8_8_;
                              pMVar28[2].elemsize = auVar99._0_8_;
                              pMVar28[2].elempack = auVar99._8_4_;
                              *(int *)&pMVar28[2].field_0x1c = auVar99._12_4_;
                              pMVar28[2].allocator = (Allocator *)auVar124._0_8_;
                              pMVar28[2].dims = auVar124._8_4_;
                              pMVar28[2].w = auVar124._12_4_;
                              pMVar28 = (Mat *)&pMVar28[2].h;
                              pauVar22 = pauVar22 + local_228.cstep;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                          }
                          if (local_228.elempack == 1 && 0 < iVar40) {
                            pauVar21 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       lVar18 * 4 +
                                       lVar43 * 4 + local_228.cstep * lVar31 * local_228.elemsize);
                            uVar23 = uVar41;
                            do {
                              uVar1 = *(undefined8 *)((long)(pauVar21 + 1) + 0);
                              uVar25 = *(undefined4 *)((long)(pauVar21 + 1) + 8);
                              uVar9 = *(undefined4 *)((long)(pauVar21 + 1) + 0xc);
                              *(undefined1 (*) [32])pMVar28 = *pauVar21;
                              pMVar28->allocator = (Allocator *)uVar1;
                              pMVar28->dims = uVar25;
                              pMVar28->w = uVar9;
                              pMVar28 = (Mat *)&pMVar28->h;
                              pauVar21 = (undefined1 (*) [32])(*pauVar21 + local_228.cstep * 4);
                              auVar98._4_4_ = (int)uVar23 - 1;
                              uVar23 = (ulong)auVar98._4_4_;
                            } while (auVar98._4_4_ != 0);
                          }
                        }
LAB_00201908:
                        lVar36 = lVar43 + 0xc;
                        uVar30 = lVar43 + 0x17;
                        uVar23 = local_198;
                        lVar43 = lVar36;
                      } while (uVar30 < uVar50);
                    }
                    lVar43 = (long)(int)uVar50;
                    if ((int)lVar36 + 7 < (int)uVar50) {
                      iVar49 = iVar40 + 3;
                      if (-1 < iVar40) {
                        iVar49 = iVar40;
                      }
                      iVar34 = iVar40 + 7;
                      if (-1 < iVar40) {
                        iVar34 = iVar40;
                      }
                      iVar29 = iVar51 + 3;
                      iVar54 = iVar51 + 7;
                      if (-1 < iVar51) {
                        iVar29 = iVar51;
                        iVar54 = iVar51;
                      }
                      lVar48 = (long)(int)lVar36;
                      do {
                        if (local_228.elempack == 8) {
                          if (7 < iVar40) {
                            pauVar21 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       (lVar48 + lVar18) * 0x20 +
                                       local_228.cstep * (long)(iVar54 >> 3) * local_228.elemsize);
                            iVar33 = iVar34 >> 3;
                            do {
                              auVar76 = vunpcklps_avx(*pauVar21,pauVar21[1]);
                              auVar93 = vunpckhps_avx(*pauVar21,pauVar21[1]);
                              auVar142 = vunpcklps_avx(pauVar21[2],pauVar21[3]);
                              auVar107 = vunpckhps_avx(pauVar21[2],pauVar21[3]);
                              auVar174 = vunpcklps_avx(pauVar21[4],pauVar21[5]);
                              auVar119 = vunpckhps_avx(pauVar21[4],pauVar21[5]);
                              auVar141 = vunpcklps_avx(pauVar21[6],pauVar21[7]);
                              auVar127 = vunpckhps_avx(pauVar21[6],pauVar21[7]);
                              auVar134 = vunpcklpd_avx(auVar76,auVar142);
                              auVar76 = vunpckhpd_avx(auVar76,auVar142);
                              auVar142 = vunpcklpd_avx(auVar93,auVar107);
                              auVar93 = vunpckhpd_avx(auVar93,auVar107);
                              auVar148 = vunpcklpd_avx(auVar174,auVar141);
                              auVar107 = vunpckhpd_avx(auVar174,auVar141);
                              auVar174 = vunpcklpd_avx(auVar119,auVar127);
                              auVar119 = vunpckhpd_avx(auVar119,auVar127);
                              auVar98 = auVar148._0_16_;
                              auVar83 = auVar76._0_16_;
                              auVar82 = auVar107._0_16_;
                              auVar163._16_16_ = auVar174._0_16_;
                              auVar163._0_16_ = auVar142._0_16_;
                              auVar58 = auVar93._0_16_;
                              auVar84 = auVar119._0_16_;
                              auVar127 = vperm2f128_avx(auVar134,auVar148,0x31);
                              auVar76 = vperm2f128_avx(auVar76,auVar107,0x31);
                              auVar107 = vperm2f128_avx(auVar142,auVar174,0x31);
                              auVar93 = vperm2f128_avx(auVar93,auVar119,0x31);
                              pMVar28->data = (void *)SUB168(auVar134._0_16_,0);
                              pMVar28->refcount = (int *)SUB168(auVar134._0_16_,8);
                              pMVar28->elemsize = auVar98._0_8_;
                              pMVar28->elempack = auVar98._8_4_;
                              *(int *)&pMVar28->field_0x1c = auVar98._12_4_;
                              pMVar28->allocator = (Allocator *)auVar83._0_8_;
                              pMVar28->dims = auVar83._8_4_;
                              pMVar28->w = auVar83._12_4_;
                              pMVar28->h = auVar82._0_4_;
                              pMVar28->d = auVar82._4_4_;
                              pMVar28->c = auVar82._8_4_;
                              *(int *)&pMVar28->field_0x3c = auVar82._12_4_;
                              *(undefined1 (*) [32])&pMVar28->cstep = auVar163;
                              pMVar28[1].elempack = auVar58._0_4_;
                              *(int *)&pMVar28[1].field_0x1c = auVar58._4_4_;
                              pMVar28[1].allocator = (Allocator *)auVar58._8_8_;
                              pMVar28[1].dims = auVar84._0_4_;
                              pMVar28[1].w = auVar84._4_4_;
                              pMVar28[1].h = auVar84._8_4_;
                              pMVar28[1].d = auVar84._12_4_;
                              *(undefined1 (*) [32])&pMVar28[1].c = auVar127;
                              pMVar28[2].elemsize = auVar76._0_8_;
                              pMVar28[2].elempack = auVar76._8_4_;
                              *(int *)&pMVar28[2].field_0x1c = auVar76._12_4_;
                              pMVar28[2].allocator = (Allocator *)auVar76._16_8_;
                              pMVar28[2].dims = auVar76._24_4_;
                              pMVar28[2].w = auVar76._28_4_;
                              *(undefined1 (*) [32])&pMVar28[2].h = auVar107;
                              pMVar28[3].refcount = (int *)auVar93._0_8_;
                              pMVar28[3].elemsize = auVar93._8_8_;
                              pMVar28[3].elempack = auVar93._16_4_;
                              *(int *)&pMVar28[3].field_0x1c = auVar93._20_4_;
                              pMVar28[3].allocator = (Allocator *)auVar93._24_8_;
                              pMVar28 = (Mat *)&pMVar28[3].dims;
                              pauVar21 = pauVar21 + local_228.cstep;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                            goto LAB_00201ac9;
                          }
                        }
                        else {
LAB_00201ac9:
                          if (local_228.elempack == 4) {
                            if (iVar40 < 4) goto LAB_00201bf5;
                            pauVar22 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       (lVar48 + lVar18) * 0x10 +
                                       local_228.cstep * (long)(iVar29 >> 2) * local_228.elemsize);
                            iVar33 = iVar49 >> 2;
                            do {
                              auVar98 = vpunpckldq_avx(*pauVar22,pauVar22[1]);
                              auVar82 = vpunpckldq_avx(pauVar22[2],pauVar22[3]);
                              auVar58 = vpunpckhdq_avx(*pauVar22,pauVar22[1]);
                              auVar83 = vpunpckhdq_avx(pauVar22[2],pauVar22[3]);
                              auVar84 = vpunpcklqdq_avx(auVar98,auVar82);
                              auVar98 = vpunpckhqdq_avx(auVar98,auVar82);
                              auVar82 = vpunpcklqdq_avx(auVar58,auVar83);
                              auVar58 = vpunpckhqdq_avx(auVar58,auVar83);
                              auVar83 = vunpcklps_avx(pauVar22[4],pauVar22[5]);
                              auVar131 = vunpcklps_avx(pauVar22[6],pauVar22[7]);
                              auVar99 = vunpckhps_avx(pauVar22[4],pauVar22[5]);
                              auVar113 = vunpckhps_avx(pauVar22[6],pauVar22[7]);
                              auVar124 = vunpcklpd_avx(auVar83,auVar131);
                              auVar83 = vunpckhpd_avx(auVar83,auVar131);
                              auVar131 = vunpcklpd_avx(auVar99,auVar113);
                              auVar99 = vunpckhpd_avx(auVar99,auVar113);
                              pMVar28->data = (void *)auVar84._0_8_;
                              pMVar28->refcount = (int *)auVar84._8_8_;
                              pMVar28->elemsize = auVar124._0_8_;
                              pMVar28->elempack = auVar124._8_4_;
                              *(int *)&pMVar28->field_0x1c = auVar124._12_4_;
                              pMVar28->allocator = (Allocator *)auVar98._0_8_;
                              pMVar28->dims = auVar98._8_4_;
                              pMVar28->w = auVar98._12_4_;
                              pMVar28->h = auVar83._0_4_;
                              pMVar28->d = auVar83._4_4_;
                              pMVar28->c = auVar83._8_4_;
                              *(int *)&pMVar28->field_0x3c = auVar83._12_4_;
                              *(undefined1 (*) [16])&pMVar28->cstep = auVar82;
                              pMVar28[1].refcount = (int *)auVar131._0_8_;
                              pMVar28[1].elemsize = auVar131._8_8_;
                              pMVar28[1].elempack = auVar58._0_4_;
                              *(int *)&pMVar28[1].field_0x1c = auVar58._4_4_;
                              pMVar28[1].allocator = (Allocator *)auVar58._8_8_;
                              pMVar28[1].dims = auVar99._0_4_;
                              pMVar28[1].w = auVar99._4_4_;
                              pMVar28[1].h = auVar99._8_4_;
                              pMVar28[1].d = auVar99._12_4_;
                              pMVar28 = (Mat *)&pMVar28[1].c;
                              pauVar22 = pauVar22 + local_228.cstep;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                          }
                          if (local_228.elempack == 1 && 0 < iVar40) {
                            pauVar21 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       lVar18 * 4 +
                                       lVar48 * 4 + local_228.cstep * lVar31 * local_228.elemsize);
                            uVar23 = uVar41;
                            do {
                              *(undefined1 (*) [32])pMVar28 = *pauVar21;
                              pMVar28 = (Mat *)&pMVar28->allocator;
                              pauVar21 = (undefined1 (*) [32])(*pauVar21 + local_228.cstep * 4);
                              auVar98._4_4_ = (int)uVar23 - 1;
                              uVar23 = (ulong)auVar98._4_4_;
                            } while (auVar98._4_4_ != 0);
                          }
                        }
LAB_00201bf5:
                        lVar36 = lVar48 + 8;
                        bVar13 = lVar48 < lVar43 + -0xf;
                        uVar23 = local_198;
                        lVar48 = lVar36;
                      } while (bVar13);
                    }
                    if ((int)((uint)lVar36 | 3) < (int)uVar50) {
                      iVar49 = iVar40 + 3;
                      if (-1 < iVar40) {
                        iVar49 = iVar40;
                      }
                      iVar34 = iVar40 + 7;
                      if (-1 < iVar40) {
                        iVar34 = iVar40;
                      }
                      iVar29 = iVar51 + 3;
                      iVar54 = iVar51 + 7;
                      if (-1 < iVar51) {
                        iVar29 = iVar51;
                        iVar54 = iVar51;
                      }
                      lVar48 = (long)(int)(uint)lVar36;
                      do {
                        if (local_228.elempack == 8) {
                          if (7 < iVar40) {
                            pauVar21 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       (lVar48 + lVar18) * 0x20 +
                                       local_228.cstep * (long)(iVar54 >> 3) * local_228.elemsize);
                            iVar33 = iVar34 >> 3;
                            do {
                              auVar76 = vunpcklps_avx(*pauVar21,pauVar21[1]);
                              auVar93 = vunpckhps_avx(*pauVar21,pauVar21[1]);
                              auVar127 = vunpcklps_avx(pauVar21[2],pauVar21[3]);
                              auVar107 = vunpckhps_avx(pauVar21[2],pauVar21[3]);
                              auVar119 = vunpcklpd_avx(auVar76,auVar127);
                              auVar76 = vunpckhpd_avx(auVar76,auVar127);
                              auVar127 = vunpcklpd_avx(auVar93,auVar107);
                              auVar93 = vunpckhpd_avx(auVar93,auVar107);
                              auVar83 = auVar76._0_16_;
                              auVar98 = auVar127._0_16_;
                              auVar58 = auVar93._0_16_;
                              auVar76 = vperm2f128_avx(auVar119,auVar76,0x31);
                              auVar93 = vperm2f128_avx(auVar127,auVar93,0x31);
                              pMVar28->data = (void *)SUB168(auVar119._0_16_,0);
                              pMVar28->refcount = (int *)SUB168(auVar119._0_16_,8);
                              pMVar28->elemsize = auVar83._0_8_;
                              pMVar28->elempack = auVar83._8_4_;
                              *(int *)&pMVar28->field_0x1c = auVar83._12_4_;
                              pMVar28->allocator = (Allocator *)auVar98._0_8_;
                              pMVar28->dims = auVar98._8_4_;
                              pMVar28->w = auVar98._12_4_;
                              pMVar28->h = auVar58._0_4_;
                              pMVar28->d = auVar58._4_4_;
                              pMVar28->c = auVar58._8_4_;
                              *(int *)&pMVar28->field_0x3c = auVar58._12_4_;
                              *(undefined1 (*) [32])&pMVar28->cstep = auVar76;
                              pMVar28[1].elempack = auVar93._0_4_;
                              *(int *)&pMVar28[1].field_0x1c = auVar93._4_4_;
                              pMVar28[1].allocator = (Allocator *)auVar93._8_8_;
                              pMVar28[1].dims = auVar93._16_4_;
                              pMVar28[1].w = auVar93._20_4_;
                              pMVar28[1].h = auVar93._24_4_;
                              pMVar28[1].d = auVar93._28_4_;
                              pMVar28 = (Mat *)&pMVar28[1].c;
                              pauVar21 = pauVar21 + local_228.cstep;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                            goto LAB_00201d28;
                          }
                        }
                        else {
LAB_00201d28:
                          if (local_228.elempack == 4) {
                            if (iVar40 < 4) goto LAB_00201e04;
                            pauVar22 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       (lVar48 + lVar18) * 0x10 +
                                       local_228.cstep * (long)(iVar29 >> 2) * local_228.elemsize);
                            iVar33 = iVar49 >> 2;
                            do {
                              auVar98 = vpunpckldq_avx(*pauVar22,pauVar22[1]);
                              auVar82 = vpunpckldq_avx(pauVar22[2],pauVar22[3]);
                              auVar58 = vpunpckhdq_avx(*pauVar22,pauVar22[1]);
                              auVar83 = vpunpckhdq_avx(pauVar22[2],pauVar22[3]);
                              auVar84 = vpunpcklqdq_avx(auVar98,auVar82);
                              auVar98 = vpunpckhqdq_avx(auVar98,auVar82);
                              auVar82 = vpunpcklqdq_avx(auVar58,auVar83);
                              auVar58 = vpunpckhqdq_avx(auVar58,auVar83);
                              pMVar28->data = (void *)auVar84._0_8_;
                              pMVar28->refcount = (int *)auVar84._8_8_;
                              pMVar28->elemsize = auVar98._0_8_;
                              pMVar28->elempack = auVar98._8_4_;
                              *(int *)&pMVar28->field_0x1c = auVar98._12_4_;
                              pMVar28->allocator = (Allocator *)auVar82._0_8_;
                              pMVar28->dims = auVar82._8_4_;
                              pMVar28->w = auVar82._12_4_;
                              pMVar28->h = auVar58._0_4_;
                              pMVar28->d = auVar58._4_4_;
                              pMVar28->c = auVar58._8_4_;
                              *(int *)&pMVar28->field_0x3c = auVar58._12_4_;
                              pMVar28 = (Mat *)&pMVar28->cstep;
                              pauVar22 = pauVar22 + local_228.cstep;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                          }
                          if (local_228.elempack == 1 && 0 < iVar40) {
                            pauVar22 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       lVar18 * 4 +
                                       lVar48 * 4 + local_228.cstep * lVar31 * local_228.elemsize);
                            uVar23 = uVar41;
                            do {
                              *(undefined1 (*) [16])pMVar28 = *pauVar22;
                              pMVar28 = (Mat *)&pMVar28->elemsize;
                              pauVar22 = (undefined1 (*) [16])(*pauVar22 + local_228.cstep * 4);
                              auVar98._4_4_ = (int)uVar23 - 1;
                              uVar23 = (ulong)auVar98._4_4_;
                            } while (auVar98._4_4_ != 0);
                          }
                        }
LAB_00201e04:
                        lVar36 = lVar48 + 4;
                        lVar47 = lVar48 + 7;
                        uVar23 = local_198;
                        lVar48 = lVar36;
                      } while (lVar47 < lVar43);
                    }
                    auVar98._4_4_ = (uint)lVar36;
                    if ((int)(auVar98._4_4_ | 1) < (int)uVar50) {
                      iVar49 = iVar40 + 3;
                      if (-1 < iVar40) {
                        iVar49 = iVar40;
                      }
                      iVar34 = iVar40 + 7;
                      if (-1 < iVar40) {
                        iVar34 = iVar40;
                      }
                      iVar29 = iVar51 + 3;
                      iVar54 = iVar51 + 7;
                      if (-1 < iVar51) {
                        iVar29 = iVar51;
                        iVar54 = iVar51;
                      }
                      lVar48 = lVar18 * 4 + (long)(int)auVar98._4_4_ * 4;
                      lVar47 = (long)(int)auVar98._4_4_;
                      do {
                        if (local_228.elempack == 8) {
                          if (7 < iVar40) {
                            pauVar21 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       (lVar47 + lVar18) * 0x20 +
                                       local_228.cstep * (long)(iVar54 >> 3) * local_228.elemsize);
                            iVar33 = iVar34 >> 3;
                            do {
                              auVar93 = vunpcklps_avx(*pauVar21,pauVar21[1]);
                              auVar76 = vunpckhps_avx(*pauVar21,pauVar21[1]);
                              auVar58 = auVar76._0_16_;
                              auVar76 = vperm2f128_avx(auVar93,auVar76,0x31);
                              pMVar28->data = (void *)SUB168(auVar93._0_16_,0);
                              pMVar28->refcount = (int *)SUB168(auVar93._0_16_,8);
                              pMVar28->elemsize = auVar58._0_8_;
                              pMVar28->elempack = auVar58._8_4_;
                              *(int *)&pMVar28->field_0x1c = auVar58._12_4_;
                              pMVar28->allocator = (Allocator *)auVar76._0_8_;
                              pMVar28->dims = auVar76._8_4_;
                              pMVar28->w = auVar76._12_4_;
                              pMVar28->h = auVar76._16_4_;
                              pMVar28->d = auVar76._20_4_;
                              pMVar28->c = auVar76._24_4_;
                              *(int *)&pMVar28->field_0x3c = auVar76._28_4_;
                              pMVar28 = (Mat *)&pMVar28->cstep;
                              pauVar21 = pauVar21 + local_228.cstep;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                            goto LAB_00201f14;
                          }
                        }
                        else {
LAB_00201f14:
                          if (local_228.elempack == 4) {
                            if (iVar40 < 4) goto LAB_00201fc5;
                            pauVar22 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       (lVar47 + lVar18) * 0x10 +
                                       local_228.cstep * (long)(iVar29 >> 2) * local_228.elemsize);
                            iVar33 = iVar49 >> 2;
                            do {
                              auVar83 = vpunpckldq_avx(*pauVar22,pauVar22[1]);
                              auVar58 = vpunpckhdq_avx(*pauVar22,pauVar22[1]);
                              pMVar28->data = (void *)auVar83._0_8_;
                              pMVar28->refcount = (int *)auVar83._8_8_;
                              pMVar28->elemsize = auVar58._0_8_;
                              pMVar28->elempack = auVar58._8_4_;
                              *(int *)&pMVar28->field_0x1c = auVar58._12_4_;
                              pMVar28 = (Mat *)&pMVar28->allocator;
                              pauVar22 = pauVar22 + local_228.cstep;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                          }
                          if (local_228.elempack == 1 && 0 < iVar40) {
                            puVar55 = (undefined4 *)
                                      (local_228.cstep * lVar31 * local_228.elemsize + lVar48 +
                                      (long)local_228.data);
                            uVar23 = uVar41;
                            do {
                              *(undefined4 *)&pMVar28->data = *puVar55;
                              *(undefined4 *)((long)&pMVar28->data + 4) = puVar55[1];
                              pMVar28 = (Mat *)&pMVar28->refcount;
                              puVar55 = puVar55 + local_228.cstep;
                              auVar98._4_4_ = (int)uVar23 - 1;
                              uVar23 = (ulong)auVar98._4_4_;
                            } while (auVar98._4_4_ != 0);
                          }
                        }
LAB_00201fc5:
                        lVar36 = lVar47 + 2;
                        lVar35 = lVar47 + 3;
                        lVar48 = lVar48 + 8;
                        uVar23 = local_198;
                        lVar47 = lVar36;
                      } while (lVar35 < lVar43);
                    }
                    if ((int)lVar36 < (int)uVar50) {
                      iVar49 = iVar40 + 3;
                      if (-1 < iVar40) {
                        iVar49 = iVar40;
                      }
                      iVar34 = iVar40 + 7;
                      if (-1 < iVar40) {
                        iVar34 = iVar40;
                      }
                      iVar54 = iVar51 + 3;
                      iVar29 = iVar51 + 7;
                      if (-1 < iVar51) {
                        iVar54 = iVar51;
                        iVar29 = iVar51;
                      }
                      lVar48 = (long)(int)lVar36;
                      lVar36 = lVar18 * 4 + lVar48 * 4;
                      do {
                        if (local_228.elempack == 8) {
                          if (7 < iVar40) {
                            pauVar21 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       (lVar48 + lVar18) * 0x20 +
                                       local_228.cstep * (long)(iVar29 >> 3) * local_228.elemsize);
                            iVar51 = iVar34 >> 3;
                            do {
                              *(undefined1 (*) [32])pMVar28 = *pauVar21;
                              pMVar28 = (Mat *)&pMVar28->allocator;
                              pauVar21 = pauVar21 + local_228.cstep;
                              iVar51 = iVar51 + -1;
                            } while (iVar51 != 0);
                            goto LAB_002020b1;
                          }
                        }
                        else {
LAB_002020b1:
                          if (local_228.elempack == 4) {
                            if (iVar40 < 4) goto LAB_00202146;
                            pauVar22 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       (lVar48 + lVar18) * 0x10 +
                                       local_228.cstep * (long)(iVar54 >> 2) * local_228.elemsize);
                            iVar51 = iVar49 >> 2;
                            do {
                              *(undefined1 (*) [16])pMVar28 = *pauVar22;
                              pMVar28 = (Mat *)&pMVar28->elemsize;
                              pauVar22 = pauVar22 + local_228.cstep;
                              iVar51 = iVar51 + -1;
                            } while (iVar51 != 0);
                          }
                          if (local_228.elempack == 1 && 0 < iVar40) {
                            puVar55 = (undefined4 *)
                                      (local_228.cstep * lVar31 * local_228.elemsize + lVar36 +
                                      (long)local_228.data);
                            uVar23 = uVar41;
                            do {
                              *(undefined4 *)&pMVar28->data = *puVar55;
                              pMVar28 = (Mat *)((long)&pMVar28->data + 4);
                              puVar55 = puVar55 + local_228.cstep;
                              auVar98._4_4_ = (int)uVar23 - 1;
                              uVar23 = (ulong)auVar98._4_4_;
                            } while (auVar98._4_4_ != 0);
                          }
                        }
LAB_00202146:
                        lVar48 = lVar48 + 1;
                        lVar36 = lVar36 + 4;
                        uVar23 = local_198;
                      } while (lVar48 != lVar43);
                    }
                  }
                  iVar14 = iVar14 + 1;
                  pMVar28 = local_1d0;
                } while (iVar14 != (int)local_1d8);
              }
              local_118.cstep = 0;
              local_118.data = (void *)0x0;
              local_118.refcount._0_4_ = 0;
              local_118.refcount._4_4_ = 0;
              local_118.elemsize._0_1_ = 0;
              local_118.elemsize._1_7_ = 0;
              local_118.elempack = 0;
              local_118.allocator = (Allocator *)0x0;
              local_118.dims = 0;
              local_118.w = 0;
              local_118.h = 0;
              local_118.d = 0;
              local_118.c = 0;
              if ((int)local_1b0 < (int)uVar27) {
                Mat::create(&local_118,(int)local_70 * uVar17,1,(int)local_138,4,
                            opt->workspace_allocator);
                iVar14 = -100;
                if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0))
                goto LAB_002024b6;
              }
              else {
LAB_002024b6:
                if (0 < (int)local_120) {
                  local_a8 = 0;
                  do {
                    iVar14 = TILE_M;
                    if ((int)local_1b0 < (int)uVar27) {
                      iVar49 = get_omp_thread_num();
                      local_98 = (undefined1 (*) [32])
                                 ((long)iVar49 * local_118.cstep *
                                  CONCAT71(local_118.elemsize._1_7_,(byte)local_118.elemsize) +
                                 (long)local_118.data);
                    }
                    else {
                      local_98 = (undefined1 (*) [32])0x0;
                    }
                    iVar49 = iVar14 * (int)local_a8;
                    uVar50 = (int)uVar23 - iVar49;
                    if (iVar14 < (int)uVar50) {
                      uVar50 = iVar14;
                    }
                    iVar14 = (int)local_a0;
                    if (0 < iVar14) {
                      local_190 = (long)iVar49;
                      local_128 = (long)(int)uVar50;
                      iVar51 = 0;
                      do {
                        uVar26 = iVar14 - iVar51;
                        if ((int)uVar17 < iVar14 - iVar51) {
                          uVar26 = uVar17;
                        }
                        iVar40 = (int)uVar27;
                        if (0 < iVar40) {
                          local_58 = (long)iVar51;
                          uVar41 = 0;
                          do {
                            iVar34 = (int)uVar41;
                            local_5c = iVar40 - iVar34;
                            uVar17 = (uint)local_1b0;
                            uVar23 = (ulong)local_5c;
                            if ((int)uVar17 < (int)local_5c) {
                              uVar23 = local_1b0 & 0xffffffff;
                            }
                            pauVar21 = (undefined1 (*) [32])(this->super_Convolution).bias_data.data
                            ;
                            sVar38 = (this->weight_sgemm_data).elemsize;
                            pfVar42 = (float *)((long)(this->weight_sgemm_data).data +
                                               (long)(this->weight_sgemm_data).w * sVar38 *
                                               (long)(iVar34 / (int)uVar17) +
                                               (long)(iVar49 / TILE_M) *
                                               (this->weight_sgemm_data).cstep * sVar38);
                            local_1d8 = (float *)((long)local_188.data +
                                                 (long)local_188.w * local_188.elemsize *
                                                 (long)(iVar34 / (int)uVar17) +
                                                 (long)(iVar51 / TILE_N) * local_188.cstep *
                                                 local_188.elemsize);
                            iVar24 = iVar34 + uVar17;
                            iVar54 = pMVar28->elempack;
                            local_90 = pMVar28->cstep;
                            iVar33 = (int)uVar23;
                            iVar29 = (int)local_90;
                            pauVar52 = local_98;
                            if ((int)uVar50 < 8) {
                              uVar30 = 0;
                            }
                            else {
                              local_40 = (long)(iVar54 * iVar51);
                              lVar18 = (long)(iVar29 * 2);
                              lVar31 = (long)(local_90 * 0x300000000) >> 0x20;
                              lVar43 = (long)(iVar29 * 4);
                              lVar36 = (long)((local_90 << 0x20) * 5) >> 0x20;
                              local_1c8 = (long)((local_90 << 0x21) * 3) >> 0x20;
                              lVar47 = (long)(local_90 * 0x700000000) >> 0x20;
                              local_138 = (ulong)(iVar29 * 3);
                              local_b0 = (ulong)(iVar29 * 5);
                              local_b8 = (ulong)(iVar29 * 6);
                              local_c0 = (ulong)(iVar29 * 7);
                              local_130 = (long)((local_90 << 0x20) + 0x100000000) >> 0x20;
                              local_c8 = (Option *)(long)(iVar29 * 2 + 1);
                              local_d0 = (Option *)(long)(iVar29 * 3 + 1);
                              local_68 = (long)(iVar29 * 4 + 1);
                              local_70 = (ulong)(iVar29 * 5 + 1);
                              local_78 = (long)(iVar29 * 6 + 1);
                              local_80 = (long)(iVar29 * 7 + 1);
                              local_48 = (long)(iVar33 * 8) * 4;
                              lVar48 = (long)iVar29;
                              local_1b8 = CONCAT44(local_1b8._4_4_,iVar54);
                              uVar30 = 0;
                              pauVar45 = pauVar21;
                              do {
                                local_38 = uVar30;
                                pauVar21 = (undefined1 (*) [32])
                                           ((long)(this->super_Convolution).bias_data.data +
                                           local_38 * 4 + local_190 * 4);
                                if (pauVar45 == (undefined1 (*) [32])0x0) {
                                  pauVar21 = pauVar45;
                                }
                                uVar53 = 0;
                                pauVar45 = (undefined1 (*) [32])
                                           ((long)local_1d0->data +
                                           local_40 * 4 + (local_38 + local_190) * lVar48 * 4);
                                pfVar44 = local_1d8;
                                if (0xb < (int)uVar26) {
                                  uVar15 = 0;
                                  do {
                                    if (iVar34 == 0) {
                                      if (pauVar21 == (undefined1 (*) [32])0x0) {
                                        auVar81 = ZEXT1664((undefined1  [16])0x0);
                                        auVar97 = ZEXT1664((undefined1  [16])0x0);
                                        auVar112 = ZEXT1664((undefined1  [16])0x0);
                                        auVar123 = ZEXT864(0) << 0x40;
                                        auVar130 = ZEXT864(0) << 0x40;
                                        auVar138 = ZEXT864(0) << 0x40;
                                        auVar145 = ZEXT864(0) << 0x40;
                                        auVar151 = ZEXT864(0) << 0x40;
                                        auVar155 = ZEXT864(0) << 0x40;
                                        auVar161 = ZEXT864(0) << 0x40;
                                        auVar167 = ZEXT864(0) << 0x40;
                                        auVar173 = ZEXT864(0) << 0x40;
                                      }
                                      else {
                                        auVar76 = *pauVar21;
                                        auVar81 = ZEXT3264(auVar76);
                                        auVar97 = ZEXT3264(auVar76);
                                        auVar112 = ZEXT3264(auVar76);
                                        auVar123 = ZEXT3264(auVar76);
                                        auVar130 = ZEXT3264(auVar76);
                                        auVar138 = ZEXT3264(auVar76);
                                        auVar145 = ZEXT3264(auVar76);
                                        auVar151 = ZEXT3264(auVar76);
                                        auVar155 = ZEXT3264(auVar76);
                                        auVar161 = ZEXT3264(auVar76);
                                        auVar167 = ZEXT3264(auVar76);
                                        auVar173 = ZEXT3264(auVar76);
                                      }
                                    }
                                    else {
                                      auVar173 = ZEXT3264(*pauVar52);
                                      auVar167 = ZEXT3264(pauVar52[1]);
                                      auVar161 = ZEXT3264(pauVar52[2]);
                                      auVar155 = ZEXT3264(pauVar52[3]);
                                      auVar151 = ZEXT3264(pauVar52[4]);
                                      auVar145 = ZEXT3264(pauVar52[5]);
                                      auVar138 = ZEXT3264(pauVar52[6]);
                                      auVar130 = ZEXT3264(pauVar52[7]);
                                      auVar123 = ZEXT3264(pauVar52[8]);
                                      auVar112 = ZEXT3264(pauVar52[9]);
                                      auVar97 = ZEXT3264(pauVar52[10]);
                                      auVar81 = ZEXT3264(pauVar52[0xb]);
                                    }
                                    auVar127 = auVar130._0_32_;
                                    auVar134 = auVar138._0_32_;
                                    auVar142 = auVar145._0_32_;
                                    auVar148 = auVar151._0_32_;
                                    auVar153 = auVar155._0_32_;
                                    auVar157 = auVar161._0_32_;
                                    auVar164 = auVar167._0_32_;
                                    auVar169 = auVar173._0_32_;
                                    auVar76 = auVar81._0_32_;
                                    auVar93 = auVar97._0_32_;
                                    auVar107 = auVar112._0_32_;
                                    auVar119 = auVar123._0_32_;
                                    pfVar32 = pfVar42;
                                    uVar30 = uVar23;
                                    if (0 < iVar33) {
                                      do {
                                        fVar2 = *pfVar32;
                                        fVar3 = pfVar32[1];
                                        fVar4 = pfVar32[2];
                                        fVar5 = pfVar32[3];
                                        fVar6 = pfVar32[4];
                                        fVar7 = pfVar32[5];
                                        fVar8 = pfVar32[6];
                                        fVar57 = *pfVar44;
                                        auVar169._0_4_ = fVar57 * fVar2 + auVar173._0_4_;
                                        auVar169._4_4_ = fVar57 * fVar3 + auVar173._4_4_;
                                        auVar169._8_4_ = fVar57 * fVar4 + auVar173._8_4_;
                                        auVar169._12_4_ = fVar57 * fVar5 + auVar173._12_4_;
                                        auVar169._16_4_ = fVar57 * fVar6 + auVar173._16_4_;
                                        auVar169._20_4_ = fVar57 * fVar7 + auVar173._20_4_;
                                        auVar169._24_4_ = fVar57 * fVar8 + auVar173._24_4_;
                                        auVar169._28_4_ = fVar57 + auVar173._28_4_;
                                        auVar173 = ZEXT3264(auVar169);
                                        fVar57 = pfVar44[1];
                                        auVar164._0_4_ = fVar57 * fVar2 + auVar167._0_4_;
                                        auVar164._4_4_ = fVar57 * fVar3 + auVar167._4_4_;
                                        auVar164._8_4_ = fVar57 * fVar4 + auVar167._8_4_;
                                        auVar164._12_4_ = fVar57 * fVar5 + auVar167._12_4_;
                                        auVar164._16_4_ = fVar57 * fVar6 + auVar167._16_4_;
                                        auVar164._20_4_ = fVar57 * fVar7 + auVar167._20_4_;
                                        auVar164._24_4_ = fVar57 * fVar8 + auVar167._24_4_;
                                        auVar164._28_4_ = fVar57 + auVar167._28_4_;
                                        auVar167 = ZEXT3264(auVar164);
                                        fVar57 = pfVar44[2];
                                        auVar157._0_4_ = fVar57 * fVar2 + auVar161._0_4_;
                                        auVar157._4_4_ = fVar57 * fVar3 + auVar161._4_4_;
                                        auVar157._8_4_ = fVar57 * fVar4 + auVar161._8_4_;
                                        auVar157._12_4_ = fVar57 * fVar5 + auVar161._12_4_;
                                        auVar157._16_4_ = fVar57 * fVar6 + auVar161._16_4_;
                                        auVar157._20_4_ = fVar57 * fVar7 + auVar161._20_4_;
                                        auVar157._24_4_ = fVar57 * fVar8 + auVar161._24_4_;
                                        auVar157._28_4_ = fVar57 + auVar161._28_4_;
                                        auVar161 = ZEXT3264(auVar157);
                                        fVar57 = pfVar44[3];
                                        auVar153._0_4_ = fVar57 * fVar2 + auVar155._0_4_;
                                        auVar153._4_4_ = fVar57 * fVar3 + auVar155._4_4_;
                                        auVar153._8_4_ = fVar57 * fVar4 + auVar155._8_4_;
                                        auVar153._12_4_ = fVar57 * fVar5 + auVar155._12_4_;
                                        auVar153._16_4_ = fVar57 * fVar6 + auVar155._16_4_;
                                        auVar153._20_4_ = fVar57 * fVar7 + auVar155._20_4_;
                                        auVar153._24_4_ = fVar57 * fVar8 + auVar155._24_4_;
                                        auVar153._28_4_ = fVar57 + auVar155._28_4_;
                                        auVar155 = ZEXT3264(auVar153);
                                        fVar57 = pfVar44[4];
                                        auVar148._0_4_ = fVar57 * fVar2 + auVar151._0_4_;
                                        auVar148._4_4_ = fVar57 * fVar3 + auVar151._4_4_;
                                        auVar148._8_4_ = fVar57 * fVar4 + auVar151._8_4_;
                                        auVar148._12_4_ = fVar57 * fVar5 + auVar151._12_4_;
                                        auVar148._16_4_ = fVar57 * fVar6 + auVar151._16_4_;
                                        auVar148._20_4_ = fVar57 * fVar7 + auVar151._20_4_;
                                        auVar148._24_4_ = fVar57 * fVar8 + auVar151._24_4_;
                                        auVar148._28_4_ = fVar57 + auVar151._28_4_;
                                        auVar151 = ZEXT3264(auVar148);
                                        fVar57 = pfVar44[5];
                                        auVar142._0_4_ = fVar57 * fVar2 + auVar145._0_4_;
                                        auVar142._4_4_ = fVar57 * fVar3 + auVar145._4_4_;
                                        auVar142._8_4_ = fVar57 * fVar4 + auVar145._8_4_;
                                        auVar142._12_4_ = fVar57 * fVar5 + auVar145._12_4_;
                                        auVar142._16_4_ = fVar57 * fVar6 + auVar145._16_4_;
                                        auVar142._20_4_ = fVar57 * fVar7 + auVar145._20_4_;
                                        auVar142._24_4_ = fVar57 * fVar8 + auVar145._24_4_;
                                        auVar142._28_4_ = fVar57 + auVar145._28_4_;
                                        auVar145 = ZEXT3264(auVar142);
                                        fVar57 = pfVar44[6];
                                        auVar134._0_4_ = fVar57 * fVar2 + auVar138._0_4_;
                                        auVar134._4_4_ = fVar57 * fVar3 + auVar138._4_4_;
                                        auVar134._8_4_ = fVar57 * fVar4 + auVar138._8_4_;
                                        auVar134._12_4_ = fVar57 * fVar5 + auVar138._12_4_;
                                        auVar134._16_4_ = fVar57 * fVar6 + auVar138._16_4_;
                                        auVar134._20_4_ = fVar57 * fVar7 + auVar138._20_4_;
                                        auVar134._24_4_ = fVar57 * fVar8 + auVar138._24_4_;
                                        auVar134._28_4_ = fVar57 + auVar138._28_4_;
                                        auVar138 = ZEXT3264(auVar134);
                                        fVar57 = pfVar44[7];
                                        auVar127._0_4_ = fVar57 * fVar2 + auVar130._0_4_;
                                        auVar127._4_4_ = fVar57 * fVar3 + auVar130._4_4_;
                                        auVar127._8_4_ = fVar57 * fVar4 + auVar130._8_4_;
                                        auVar127._12_4_ = fVar57 * fVar5 + auVar130._12_4_;
                                        auVar127._16_4_ = fVar57 * fVar6 + auVar130._16_4_;
                                        auVar127._20_4_ = fVar57 * fVar7 + auVar130._20_4_;
                                        auVar127._24_4_ = fVar57 * fVar8 + auVar130._24_4_;
                                        auVar127._28_4_ = fVar57 + auVar130._28_4_;
                                        auVar130 = ZEXT3264(auVar127);
                                        fVar57 = pfVar44[8];
                                        auVar119._0_4_ = fVar57 * fVar2 + auVar123._0_4_;
                                        auVar119._4_4_ = fVar57 * fVar3 + auVar123._4_4_;
                                        auVar119._8_4_ = fVar57 * fVar4 + auVar123._8_4_;
                                        auVar119._12_4_ = fVar57 * fVar5 + auVar123._12_4_;
                                        auVar119._16_4_ = fVar57 * fVar6 + auVar123._16_4_;
                                        auVar119._20_4_ = fVar57 * fVar7 + auVar123._20_4_;
                                        auVar119._24_4_ = fVar57 * fVar8 + auVar123._24_4_;
                                        auVar119._28_4_ = fVar57 + auVar123._28_4_;
                                        auVar123 = ZEXT3264(auVar119);
                                        fVar57 = pfVar44[9];
                                        auVar107._0_4_ = fVar57 * fVar2 + auVar112._0_4_;
                                        auVar107._4_4_ = fVar57 * fVar3 + auVar112._4_4_;
                                        auVar107._8_4_ = fVar57 * fVar4 + auVar112._8_4_;
                                        auVar107._12_4_ = fVar57 * fVar5 + auVar112._12_4_;
                                        auVar107._16_4_ = fVar57 * fVar6 + auVar112._16_4_;
                                        auVar107._20_4_ = fVar57 * fVar7 + auVar112._20_4_;
                                        auVar107._24_4_ = fVar57 * fVar8 + auVar112._24_4_;
                                        auVar107._28_4_ = fVar57 + auVar112._28_4_;
                                        auVar112 = ZEXT3264(auVar107);
                                        fVar57 = pfVar44[10];
                                        auVar93._0_4_ = fVar57 * fVar2 + auVar97._0_4_;
                                        auVar93._4_4_ = fVar57 * fVar3 + auVar97._4_4_;
                                        auVar93._8_4_ = fVar57 * fVar4 + auVar97._8_4_;
                                        auVar93._12_4_ = fVar57 * fVar5 + auVar97._12_4_;
                                        auVar93._16_4_ = fVar57 * fVar6 + auVar97._16_4_;
                                        auVar93._20_4_ = fVar57 * fVar7 + auVar97._20_4_;
                                        auVar93._24_4_ = fVar57 * fVar8 + auVar97._24_4_;
                                        auVar93._28_4_ = fVar57 + auVar97._28_4_;
                                        auVar97 = ZEXT3264(auVar93);
                                        fVar57 = pfVar44[0xb];
                                        auVar76._0_4_ = fVar57 * fVar2 + auVar81._0_4_;
                                        auVar76._4_4_ = fVar57 * fVar3 + auVar81._4_4_;
                                        auVar76._8_4_ = fVar57 * fVar4 + auVar81._8_4_;
                                        auVar76._12_4_ = fVar57 * fVar5 + auVar81._12_4_;
                                        auVar76._16_4_ = fVar57 * fVar6 + auVar81._16_4_;
                                        auVar76._20_4_ = fVar57 * fVar7 + auVar81._20_4_;
                                        auVar76._24_4_ = fVar57 * fVar8 + auVar81._24_4_;
                                        auVar76._28_4_ = pfVar32[7] + auVar81._28_4_;
                                        auVar81 = ZEXT3264(auVar76);
                                        pfVar44 = pfVar44 + 0xc;
                                        auVar98._4_4_ = (int)uVar30 - 1;
                                        pfVar32 = pfVar32 + 8;
                                        uVar30 = (ulong)auVar98._4_4_;
                                      } while (auVar98._4_4_ != 0);
                                    }
                                    if (iVar24 < iVar40) {
                                      *pauVar52 = auVar169;
                                      pauVar52[1] = auVar164;
                                      pauVar52[2] = auVar157;
                                      pauVar52[3] = auVar153;
                                      pauVar52[4] = auVar148;
                                      pauVar52[5] = auVar142;
                                      pauVar52[6] = auVar134;
                                      pauVar52[7] = auVar127;
                                      pauVar52[8] = auVar119;
                                      pauVar52[9] = auVar107;
                                      pauVar52[10] = auVar93;
                                      pauVar52[0xb] = auVar76;
                                    }
                                    else {
                                      auVar82 = auVar119._0_16_;
                                      auVar98 = auVar107._0_16_;
                                      auVar83 = auVar93._0_16_;
                                      auVar58 = auVar76._0_16_;
                                      if (iVar54 == 1) {
                                        auVar143 = vunpcklps_avx(auVar169,auVar164);
                                        auVar174 = vunpckhps_avx(auVar169,auVar164);
                                        auVar164 = vunpcklps_avx(auVar157,auVar153);
                                        auVar141 = vunpckhps_avx(auVar157,auVar153);
                                        auVar169 = vunpcklps_avx(auVar148,auVar142);
                                        auVar148 = vunpckhps_avx(auVar148,auVar142);
                                        auVar142 = vunpcklps_avx(auVar134,auVar127);
                                        auVar163 = vunpckhps_avx(auVar134,auVar127);
                                        auVar153 = vunpcklpd_avx(auVar143,auVar164);
                                        auVar127 = vunpckhpd_avx(auVar143,auVar164);
                                        auVar157 = vunpcklpd_avx(auVar174,auVar141);
                                        auVar134 = vunpckhpd_avx(auVar174,auVar141);
                                        auVar174 = vunpcklpd_avx(auVar169,auVar142);
                                        auVar142 = vunpckhpd_avx(auVar169,auVar142);
                                        auVar141 = vunpcklpd_avx(auVar148,auVar163);
                                        auVar148 = vunpckhpd_avx(auVar148,auVar163);
                                        auVar143._16_16_ = auVar174._0_16_;
                                        auVar143._0_16_ = auVar153._0_16_;
                                        auVar176._16_16_ = auVar142._0_16_;
                                        auVar176._0_16_ = auVar127._0_16_;
                                        auVar177._16_16_ = auVar141._0_16_;
                                        auVar177._0_16_ = auVar157._0_16_;
                                        auVar178._16_16_ = auVar148._0_16_;
                                        auVar178._0_16_ = auVar134._0_16_;
                                        auVar174 = vperm2f128_avx(auVar153,auVar174,0x31);
                                        auVar127 = vperm2f128_avx(auVar127,auVar142,0x31);
                                        auVar142 = vperm2f128_avx(auVar157,auVar141,0x31);
                                        auVar134 = vperm2f128_avx(auVar134,auVar148,0x31);
                                        *pauVar45 = auVar143;
                                        *(undefined1 (*) [32])(*pauVar45 + lVar48 * 4) = auVar176;
                                        *(undefined1 (*) [32])(*pauVar45 + lVar18 * 4) = auVar177;
                                        *(undefined1 (*) [32])(*pauVar45 + lVar31 * 4) = auVar178;
                                        *(undefined1 (*) [32])(*pauVar45 + lVar43 * 4) = auVar174;
                                        *(undefined1 (*) [32])(*pauVar45 + lVar36 * 4) = auVar127;
                                        *(undefined1 (*) [32])(*pauVar45 + local_1c8 * 4) = auVar142
                                        ;
                                        *(undefined1 (*) [32])(*pauVar45 + lVar47 * 4) = auVar134;
                                        auVar84 = vunpcklps_avx(auVar82,auVar98);
                                        auVar99 = vunpcklps_avx(auVar83,auVar58);
                                        auVar98 = vunpckhps_avx(auVar82,auVar98);
                                        auVar82 = vunpckhps_avx(auVar83,auVar58);
                                        auVar58 = vmovlhps_avx(auVar84,auVar99);
                                        auVar84 = vunpckhpd_avx(auVar84,auVar99);
                                        auVar83 = vmovlhps_avx(auVar98,auVar82);
                                        auVar99 = vunpckhpd_avx(auVar98,auVar82);
                                        auVar82 = vunpcklps_avx(auVar119._16_16_,auVar107._16_16_);
                                        auVar113 = vunpcklps_avx(auVar93._16_16_,auVar76._16_16_);
                                        auVar124 = vunpckhps_avx(auVar119._16_16_,auVar107._16_16_);
                                        auVar131 = vunpckhps_avx(auVar93._16_16_,auVar76._16_16_);
                                        auVar98 = vmovlhps_avx(auVar82,auVar113);
                                        auVar113 = vunpckhpd_avx(auVar82,auVar113);
                                        auVar82 = vmovlhps_avx(auVar124,auVar131);
                                        auVar124 = vunpckhpd_avx(auVar124,auVar131);
                                        *(undefined1 (*) [16])pauVar45[1] = auVar58;
                                        *(undefined1 (*) [16])(pauVar45[1] + lVar48 * 4) = auVar84;
                                        *(undefined1 (*) [16])(pauVar45[1] + lVar18 * 4) = auVar83;
                                        *(undefined1 (*) [16])(pauVar45[1] + lVar31 * 4) = auVar99;
                                        *(undefined1 (*) [16])(pauVar45[1] + lVar43 * 4) = auVar98;
                                        *(undefined1 (*) [16])(pauVar45[1] + lVar36 * 4) = auVar113;
                                        *(undefined1 (*) [16])(pauVar45[1] + local_1c8 * 4) =
                                             auVar82;
                                        *(undefined1 (*) [16])(pauVar45[1] + lVar47 * 4) = auVar124;
                                        pauVar45 = (undefined1 (*) [32])(pauVar45[1] + 0x10);
                                      }
                                      else if (iVar54 == 4) {
                                        auVar175._16_16_ = auVar164._0_16_;
                                        auVar175._0_16_ = auVar169._0_16_;
                                        auVar174 = vperm2f128_avx(auVar169,auVar164,0x31);
                                        auVar170._16_16_ = auVar153._0_16_;
                                        auVar170._0_16_ = auVar157._0_16_;
                                        auVar141 = vperm2f128_avx(auVar157,auVar153,0x31);
                                        auVar158._16_16_ = auVar142._0_16_;
                                        auVar158._0_16_ = auVar148._0_16_;
                                        auVar142 = vperm2f128_avx(auVar148,auVar142,0x31);
                                        auVar149._16_16_ = auVar127._0_16_;
                                        auVar149._0_16_ = auVar134._0_16_;
                                        auVar127 = vperm2f128_avx(auVar134,auVar127,0x31);
                                        auVar135._16_16_ = auVar98;
                                        auVar135._0_16_ = auVar82;
                                        auVar107 = vperm2f128_avx(auVar119,auVar107,0x31);
                                        auVar120._16_16_ = auVar58;
                                        auVar120._0_16_ = auVar83;
                                        auVar76 = vperm2f128_avx(auVar93,auVar76,0x31);
                                        *pauVar45 = auVar175;
                                        pauVar45[1] = auVar170;
                                        pauVar45[2] = auVar158;
                                        pauVar45[3] = auVar149;
                                        pauVar45[4] = auVar135;
                                        pauVar45[5] = auVar120;
                                        *(undefined1 (*) [32])(*pauVar45 + lVar43 * 4) = auVar174;
                                        *(undefined1 (*) [32])(pauVar45[1] + lVar43 * 4) = auVar141;
                                        *(undefined1 (*) [32])(pauVar45[2] + lVar43 * 4) = auVar142;
                                        *(undefined1 (*) [32])(pauVar45[3] + lVar43 * 4) = auVar127;
                                        *(undefined1 (*) [32])(pauVar45[4] + lVar43 * 4) = auVar107;
                                        *(undefined1 (*) [32])(pauVar45[5] + lVar43 * 4) = auVar76;
                                        pauVar45 = pauVar45 + 6;
                                      }
                                      else if (iVar54 == 8) {
                                        *pauVar45 = auVar169;
                                        pauVar45[1] = auVar164;
                                        pauVar45[2] = auVar157;
                                        pauVar45[3] = auVar153;
                                        pauVar45[4] = auVar148;
                                        pauVar45[5] = auVar142;
                                        pauVar45[6] = auVar134;
                                        pauVar45[7] = auVar127;
                                        pauVar45[8] = auVar119;
                                        pauVar45[9] = auVar107;
                                        pauVar45[10] = auVar93;
                                        pauVar45[0xb] = auVar76;
                                        pauVar45 = pauVar45 + 0xc;
                                      }
                                    }
                                    pauVar52 = pauVar52 + 0xc;
                                    uVar53 = uVar15 + 0xc;
                                    iVar16 = uVar15 + 0x17;
                                    uVar15 = uVar53;
                                  } while (iVar16 < (int)uVar26);
                                }
                                iVar16 = uVar53 + 7;
                                while (iVar16 < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar21 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar112 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar138 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar151 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar76 = *pauVar21;
                                      auVar81 = ZEXT3264(auVar76);
                                      auVar97 = ZEXT3264(auVar76);
                                      auVar112 = ZEXT3264(auVar76);
                                      auVar123 = ZEXT3264(auVar76);
                                      auVar130 = ZEXT3264(auVar76);
                                      auVar138 = ZEXT3264(auVar76);
                                      auVar145 = ZEXT3264(auVar76);
                                      auVar151 = ZEXT3264(auVar76);
                                    }
                                  }
                                  else {
                                    auVar151 = ZEXT3264(*pauVar52);
                                    auVar145 = ZEXT3264(pauVar52[1]);
                                    auVar138 = ZEXT3264(pauVar52[2]);
                                    auVar130 = ZEXT3264(pauVar52[3]);
                                    auVar123 = ZEXT3264(pauVar52[4]);
                                    auVar112 = ZEXT3264(pauVar52[5]);
                                    auVar97 = ZEXT3264(pauVar52[6]);
                                    auVar81 = ZEXT3264(pauVar52[7]);
                                  }
                                  auVar77 = auVar81._0_32_;
                                  auVar94 = auVar97._0_32_;
                                  auVar108 = auVar112._0_32_;
                                  auVar121 = auVar123._0_32_;
                                  auVar128 = auVar130._0_32_;
                                  auVar136 = auVar138._0_32_;
                                  auVar144 = auVar145._0_32_;
                                  auVar150 = auVar151._0_32_;
                                  if (0 < iVar33) {
                                    lVar35 = 0;
                                    uVar30 = uVar23;
                                    do {
                                      pfVar32 = (float *)((long)pfVar42 + lVar35);
                                      fVar2 = *pfVar32;
                                      fVar3 = pfVar32[1];
                                      fVar4 = pfVar32[2];
                                      fVar5 = pfVar32[3];
                                      fVar6 = pfVar32[4];
                                      fVar7 = pfVar32[5];
                                      fVar8 = pfVar32[6];
                                      fVar57 = *(float *)((long)pfVar44 + lVar35);
                                      auVar150._0_4_ = fVar57 * fVar2 + auVar151._0_4_;
                                      auVar150._4_4_ = fVar57 * fVar3 + auVar151._4_4_;
                                      auVar150._8_4_ = fVar57 * fVar4 + auVar151._8_4_;
                                      auVar150._12_4_ = fVar57 * fVar5 + auVar151._12_4_;
                                      auVar150._16_4_ = fVar57 * fVar6 + auVar151._16_4_;
                                      auVar150._20_4_ = fVar57 * fVar7 + auVar151._20_4_;
                                      auVar150._24_4_ = fVar57 * fVar8 + auVar151._24_4_;
                                      auVar150._28_4_ = fVar57 + auVar151._28_4_;
                                      auVar151 = ZEXT3264(auVar150);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 4);
                                      auVar144._0_4_ = fVar57 * fVar2 + auVar145._0_4_;
                                      auVar144._4_4_ = fVar57 * fVar3 + auVar145._4_4_;
                                      auVar144._8_4_ = fVar57 * fVar4 + auVar145._8_4_;
                                      auVar144._12_4_ = fVar57 * fVar5 + auVar145._12_4_;
                                      auVar144._16_4_ = fVar57 * fVar6 + auVar145._16_4_;
                                      auVar144._20_4_ = fVar57 * fVar7 + auVar145._20_4_;
                                      auVar144._24_4_ = fVar57 * fVar8 + auVar145._24_4_;
                                      auVar144._28_4_ = fVar57 + auVar145._28_4_;
                                      auVar145 = ZEXT3264(auVar144);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 8);
                                      auVar136._0_4_ = fVar57 * fVar2 + auVar138._0_4_;
                                      auVar136._4_4_ = fVar57 * fVar3 + auVar138._4_4_;
                                      auVar136._8_4_ = fVar57 * fVar4 + auVar138._8_4_;
                                      auVar136._12_4_ = fVar57 * fVar5 + auVar138._12_4_;
                                      auVar136._16_4_ = fVar57 * fVar6 + auVar138._16_4_;
                                      auVar136._20_4_ = fVar57 * fVar7 + auVar138._20_4_;
                                      auVar136._24_4_ = fVar57 * fVar8 + auVar138._24_4_;
                                      auVar136._28_4_ = fVar57 + auVar138._28_4_;
                                      auVar138 = ZEXT3264(auVar136);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 0xc);
                                      auVar128._0_4_ = fVar57 * fVar2 + auVar130._0_4_;
                                      auVar128._4_4_ = fVar57 * fVar3 + auVar130._4_4_;
                                      auVar128._8_4_ = fVar57 * fVar4 + auVar130._8_4_;
                                      auVar128._12_4_ = fVar57 * fVar5 + auVar130._12_4_;
                                      auVar128._16_4_ = fVar57 * fVar6 + auVar130._16_4_;
                                      auVar128._20_4_ = fVar57 * fVar7 + auVar130._20_4_;
                                      auVar128._24_4_ = fVar57 * fVar8 + auVar130._24_4_;
                                      auVar128._28_4_ = fVar57 + auVar130._28_4_;
                                      auVar130 = ZEXT3264(auVar128);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 0x10);
                                      auVar121._0_4_ = fVar57 * fVar2 + auVar123._0_4_;
                                      auVar121._4_4_ = fVar57 * fVar3 + auVar123._4_4_;
                                      auVar121._8_4_ = fVar57 * fVar4 + auVar123._8_4_;
                                      auVar121._12_4_ = fVar57 * fVar5 + auVar123._12_4_;
                                      auVar121._16_4_ = fVar57 * fVar6 + auVar123._16_4_;
                                      auVar121._20_4_ = fVar57 * fVar7 + auVar123._20_4_;
                                      auVar121._24_4_ = fVar57 * fVar8 + auVar123._24_4_;
                                      auVar121._28_4_ = fVar57 + auVar123._28_4_;
                                      auVar123 = ZEXT3264(auVar121);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 0x14);
                                      auVar108._0_4_ = fVar57 * fVar2 + auVar112._0_4_;
                                      auVar108._4_4_ = fVar57 * fVar3 + auVar112._4_4_;
                                      auVar108._8_4_ = fVar57 * fVar4 + auVar112._8_4_;
                                      auVar108._12_4_ = fVar57 * fVar5 + auVar112._12_4_;
                                      auVar108._16_4_ = fVar57 * fVar6 + auVar112._16_4_;
                                      auVar108._20_4_ = fVar57 * fVar7 + auVar112._20_4_;
                                      auVar108._24_4_ = fVar57 * fVar8 + auVar112._24_4_;
                                      auVar108._28_4_ = fVar57 + auVar112._28_4_;
                                      auVar112 = ZEXT3264(auVar108);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 0x18);
                                      auVar94._0_4_ = fVar57 * fVar2 + auVar97._0_4_;
                                      auVar94._4_4_ = fVar57 * fVar3 + auVar97._4_4_;
                                      auVar94._8_4_ = fVar57 * fVar4 + auVar97._8_4_;
                                      auVar94._12_4_ = fVar57 * fVar5 + auVar97._12_4_;
                                      auVar94._16_4_ = fVar57 * fVar6 + auVar97._16_4_;
                                      auVar94._20_4_ = fVar57 * fVar7 + auVar97._20_4_;
                                      auVar94._24_4_ = fVar57 * fVar8 + auVar97._24_4_;
                                      auVar94._28_4_ = fVar57 + auVar97._28_4_;
                                      auVar97 = ZEXT3264(auVar94);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 0x1c);
                                      auVar77._0_4_ = fVar57 * fVar2 + auVar81._0_4_;
                                      auVar77._4_4_ = fVar57 * fVar3 + auVar81._4_4_;
                                      auVar77._8_4_ = fVar57 * fVar4 + auVar81._8_4_;
                                      auVar77._12_4_ = fVar57 * fVar5 + auVar81._12_4_;
                                      auVar77._16_4_ = fVar57 * fVar6 + auVar81._16_4_;
                                      auVar77._20_4_ = fVar57 * fVar7 + auVar81._20_4_;
                                      auVar77._24_4_ = fVar57 * fVar8 + auVar81._24_4_;
                                      auVar77._28_4_ = pfVar32[7] + auVar81._28_4_;
                                      auVar81 = ZEXT3264(auVar77);
                                      lVar35 = lVar35 + 0x20;
                                      auVar98._4_4_ = (int)uVar30 - 1;
                                      uVar30 = (ulong)auVar98._4_4_;
                                    } while (auVar98._4_4_ != 0);
                                    pfVar44 = (float *)((long)pfVar44 + lVar35);
                                  }
                                  if (iVar24 < iVar40) {
                                    *pauVar52 = auVar150;
                                    pauVar52[1] = auVar144;
                                    pauVar52[2] = auVar136;
                                    pauVar52[3] = auVar128;
                                    pauVar52[4] = auVar121;
                                    pauVar52[5] = auVar108;
                                    pauVar52[6] = auVar94;
                                    pauVar52[7] = auVar77;
                                  }
                                  else if (iVar54 == 1) {
                                    auVar76 = vunpcklps_avx(auVar150,auVar144);
                                    auVar93 = vunpckhps_avx(auVar150,auVar144);
                                    auVar142 = vunpcklps_avx(auVar136,auVar128);
                                    auVar107 = vunpckhps_avx(auVar136,auVar128);
                                    auVar174 = vunpcklps_avx(auVar121,auVar108);
                                    auVar119 = vunpckhps_avx(auVar121,auVar108);
                                    auVar141 = vunpcklps_avx(auVar94,auVar77);
                                    auVar127 = vunpckhps_avx(auVar94,auVar77);
                                    auVar134 = vunpcklpd_avx(auVar76,auVar142);
                                    auVar76 = vunpckhpd_avx(auVar76,auVar142);
                                    auVar142 = vunpcklpd_avx(auVar93,auVar107);
                                    auVar93 = vunpckhpd_avx(auVar93,auVar107);
                                    auVar148 = vunpcklpd_avx(auVar174,auVar141);
                                    auVar107 = vunpckhpd_avx(auVar174,auVar141);
                                    auVar174 = vunpcklpd_avx(auVar119,auVar127);
                                    auVar119 = vunpckhpd_avx(auVar119,auVar127);
                                    auVar109._16_16_ = auVar148._0_16_;
                                    auVar109._0_16_ = auVar134._0_16_;
                                    auVar160._16_16_ = auVar107._0_16_;
                                    auVar160._0_16_ = auVar76._0_16_;
                                    auVar166._16_16_ = auVar174._0_16_;
                                    auVar166._0_16_ = auVar142._0_16_;
                                    auVar172._16_16_ = auVar119._0_16_;
                                    auVar172._0_16_ = auVar93._0_16_;
                                    auVar127 = vperm2f128_avx(auVar134,auVar148,0x31);
                                    auVar76 = vperm2f128_avx(auVar76,auVar107,0x31);
                                    auVar107 = vperm2f128_avx(auVar142,auVar174,0x31);
                                    auVar93 = vperm2f128_avx(auVar93,auVar119,0x31);
                                    *pauVar45 = auVar109;
                                    *(undefined1 (*) [32])(*pauVar45 + lVar48 * 4) = auVar160;
                                    *(undefined1 (*) [32])(*pauVar45 + lVar18 * 4) = auVar166;
                                    *(undefined1 (*) [32])(*pauVar45 + lVar31 * 4) = auVar172;
                                    *(undefined1 (*) [32])(*pauVar45 + lVar43 * 4) = auVar127;
                                    *(undefined1 (*) [32])(*pauVar45 + lVar36 * 4) = auVar76;
                                    *(undefined1 (*) [32])(*pauVar45 + local_1c8 * 4) = auVar107;
                                    *(undefined1 (*) [32])(*pauVar45 + lVar47 * 4) = auVar93;
                                    pauVar45 = pauVar45 + 1;
                                  }
                                  else if (iVar54 == 4) {
                                    auVar154._16_16_ = auVar144._0_16_;
                                    auVar154._0_16_ = auVar150._0_16_;
                                    auVar159._16_16_ = auVar128._0_16_;
                                    auVar159._0_16_ = auVar136._0_16_;
                                    auVar165._16_16_ = auVar108._0_16_;
                                    auVar165._0_16_ = auVar121._0_16_;
                                    auVar171._16_16_ = auVar77._0_16_;
                                    auVar171._0_16_ = auVar94._0_16_;
                                    auVar76 = vperm2f128_avx(auVar150,auVar144,0x31);
                                    auVar93 = vperm2f128_avx(auVar136,auVar128,0x31);
                                    auVar107 = vperm2f128_avx(auVar121,auVar108,0x31);
                                    auVar119 = vperm2f128_avx(auVar94,auVar77,0x31);
                                    *pauVar45 = auVar154;
                                    pauVar45[1] = auVar159;
                                    pauVar45[2] = auVar165;
                                    pauVar45[3] = auVar171;
                                    *(undefined1 (*) [32])(*pauVar45 + lVar43 * 4) = auVar76;
                                    *(undefined1 (*) [32])(pauVar45[1] + lVar43 * 4) = auVar93;
                                    *(undefined1 (*) [32])(pauVar45[2] + lVar43 * 4) = auVar107;
                                    *(undefined1 (*) [32])(pauVar45[3] + lVar43 * 4) = auVar119;
                                    pauVar45 = pauVar45 + 4;
                                  }
                                  else if (iVar54 == 8) {
                                    *pauVar45 = auVar150;
                                    pauVar45[1] = auVar144;
                                    pauVar45[2] = auVar136;
                                    pauVar45[3] = auVar128;
                                    pauVar45[4] = auVar121;
                                    pauVar45[5] = auVar108;
                                    pauVar45[6] = auVar94;
                                    pauVar45[7] = auVar77;
                                    pauVar45 = pauVar45 + 8;
                                  }
                                  pauVar52 = pauVar52 + 8;
                                  iVar16 = uVar53 + 0xf;
                                  uVar53 = uVar53 + 8;
                                }
                                auVar98._4_4_ = uVar53 | 3;
                                while ((int)auVar98._4_4_ < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar21 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar112 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar76 = *pauVar21;
                                      auVar81 = ZEXT3264(auVar76);
                                      auVar97 = ZEXT3264(auVar76);
                                      auVar112 = ZEXT3264(auVar76);
                                      auVar123 = ZEXT3264(auVar76);
                                    }
                                  }
                                  else {
                                    auVar123 = ZEXT3264(*pauVar52);
                                    auVar112 = ZEXT3264(pauVar52[1]);
                                    auVar97 = ZEXT3264(pauVar52[2]);
                                    auVar81 = ZEXT3264(pauVar52[3]);
                                  }
                                  auVar78 = auVar81._0_32_;
                                  auVar95 = auVar97._0_32_;
                                  auVar110 = auVar112._0_32_;
                                  auVar122 = auVar123._0_32_;
                                  if (0 < iVar33) {
                                    lVar35 = 0;
                                    uVar30 = uVar23;
                                    do {
                                      pfVar32 = (float *)((long)pfVar42 + lVar35 * 2);
                                      fVar2 = *pfVar32;
                                      fVar3 = pfVar32[1];
                                      fVar4 = pfVar32[2];
                                      fVar5 = pfVar32[3];
                                      fVar6 = pfVar32[4];
                                      fVar7 = pfVar32[5];
                                      fVar8 = pfVar32[6];
                                      fVar57 = *(float *)((long)pfVar44 + lVar35);
                                      auVar122._0_4_ = fVar57 * fVar2 + auVar123._0_4_;
                                      auVar122._4_4_ = fVar57 * fVar3 + auVar123._4_4_;
                                      auVar122._8_4_ = fVar57 * fVar4 + auVar123._8_4_;
                                      auVar122._12_4_ = fVar57 * fVar5 + auVar123._12_4_;
                                      auVar122._16_4_ = fVar57 * fVar6 + auVar123._16_4_;
                                      auVar122._20_4_ = fVar57 * fVar7 + auVar123._20_4_;
                                      auVar122._24_4_ = fVar57 * fVar8 + auVar123._24_4_;
                                      auVar122._28_4_ = fVar57 + auVar123._28_4_;
                                      auVar123 = ZEXT3264(auVar122);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 4);
                                      auVar110._0_4_ = fVar57 * fVar2 + auVar112._0_4_;
                                      auVar110._4_4_ = fVar57 * fVar3 + auVar112._4_4_;
                                      auVar110._8_4_ = fVar57 * fVar4 + auVar112._8_4_;
                                      auVar110._12_4_ = fVar57 * fVar5 + auVar112._12_4_;
                                      auVar110._16_4_ = fVar57 * fVar6 + auVar112._16_4_;
                                      auVar110._20_4_ = fVar57 * fVar7 + auVar112._20_4_;
                                      auVar110._24_4_ = fVar57 * fVar8 + auVar112._24_4_;
                                      auVar110._28_4_ = fVar57 + auVar112._28_4_;
                                      auVar112 = ZEXT3264(auVar110);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 8);
                                      auVar95._0_4_ = fVar57 * fVar2 + auVar97._0_4_;
                                      auVar95._4_4_ = fVar57 * fVar3 + auVar97._4_4_;
                                      auVar95._8_4_ = fVar57 * fVar4 + auVar97._8_4_;
                                      auVar95._12_4_ = fVar57 * fVar5 + auVar97._12_4_;
                                      auVar95._16_4_ = fVar57 * fVar6 + auVar97._16_4_;
                                      auVar95._20_4_ = fVar57 * fVar7 + auVar97._20_4_;
                                      auVar95._24_4_ = fVar57 * fVar8 + auVar97._24_4_;
                                      auVar95._28_4_ = fVar57 + auVar97._28_4_;
                                      auVar97 = ZEXT3264(auVar95);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 0xc);
                                      auVar78._0_4_ = fVar57 * fVar2 + auVar81._0_4_;
                                      auVar78._4_4_ = fVar57 * fVar3 + auVar81._4_4_;
                                      auVar78._8_4_ = fVar57 * fVar4 + auVar81._8_4_;
                                      auVar78._12_4_ = fVar57 * fVar5 + auVar81._12_4_;
                                      auVar78._16_4_ = fVar57 * fVar6 + auVar81._16_4_;
                                      auVar78._20_4_ = fVar57 * fVar7 + auVar81._20_4_;
                                      auVar78._24_4_ = fVar57 * fVar8 + auVar81._24_4_;
                                      auVar78._28_4_ = pfVar32[7] + auVar81._28_4_;
                                      auVar81 = ZEXT3264(auVar78);
                                      lVar35 = lVar35 + 0x10;
                                      auVar98._4_4_ = (int)uVar30 - 1;
                                      uVar30 = (ulong)auVar98._4_4_;
                                    } while (auVar98._4_4_ != 0);
                                    pfVar44 = (float *)((long)pfVar44 + lVar35);
                                  }
                                  if (iVar24 < iVar40) {
                                    *pauVar52 = auVar122;
                                    pauVar52[1] = auVar110;
                                    pauVar52[2] = auVar95;
                                    pauVar52[3] = auVar78;
                                  }
                                  else {
                                    auVar82 = auVar122._0_16_;
                                    auVar98 = auVar110._0_16_;
                                    auVar83 = auVar95._0_16_;
                                    auVar58 = auVar78._0_16_;
                                    if (iVar54 == 1) {
                                      auVar84 = vunpcklps_avx(auVar82,auVar98);
                                      auVar99 = vunpcklps_avx(auVar83,auVar58);
                                      auVar98 = vunpckhps_avx(auVar82,auVar98);
                                      auVar82 = vunpckhps_avx(auVar83,auVar58);
                                      auVar58 = vmovlhps_avx(auVar84,auVar99);
                                      auVar84 = vunpckhpd_avx(auVar84,auVar99);
                                      auVar83 = vmovlhps_avx(auVar98,auVar82);
                                      auVar99 = vunpckhpd_avx(auVar98,auVar82);
                                      auVar82 = vunpcklps_avx(auVar122._16_16_,auVar110._16_16_);
                                      auVar113 = vunpcklps_avx(auVar95._16_16_,auVar78._16_16_);
                                      auVar124 = vunpckhps_avx(auVar122._16_16_,auVar110._16_16_);
                                      auVar131 = vunpckhps_avx(auVar95._16_16_,auVar78._16_16_);
                                      auVar98 = vmovlhps_avx(auVar82,auVar113);
                                      auVar113 = vunpckhpd_avx(auVar82,auVar113);
                                      auVar82 = vmovlhps_avx(auVar124,auVar131);
                                      auVar124 = vunpckhpd_avx(auVar124,auVar131);
                                      *(undefined1 (*) [16])*pauVar45 = auVar58;
                                      *(undefined1 (*) [16])(*pauVar45 + lVar48 * 4) = auVar84;
                                      *(undefined1 (*) [16])(*pauVar45 + lVar18 * 4) = auVar83;
                                      *(undefined1 (*) [16])(*pauVar45 + lVar31 * 4) = auVar99;
                                      *(undefined1 (*) [16])(*pauVar45 + lVar43 * 4) = auVar98;
                                      *(undefined1 (*) [16])(*pauVar45 + lVar36 * 4) = auVar113;
                                      *(undefined1 (*) [16])(*pauVar45 + local_1c8 * 4) = auVar82;
                                      *(undefined1 (*) [16])(*pauVar45 + lVar47 * 4) = auVar124;
                                      pauVar45 = (undefined1 (*) [32])(*pauVar45 + 0x10);
                                    }
                                    else if (iVar54 == 4) {
                                      auVar129._16_16_ = auVar98;
                                      auVar129._0_16_ = auVar82;
                                      auVar137._16_16_ = auVar58;
                                      auVar137._0_16_ = auVar83;
                                      auVar76 = vperm2f128_avx(auVar122,auVar110,0x31);
                                      auVar93 = vperm2f128_avx(auVar95,auVar78,0x31);
                                      *pauVar45 = auVar129;
                                      pauVar45[1] = auVar137;
                                      *(undefined1 (*) [32])(*pauVar45 + lVar43 * 4) = auVar76;
                                      *(undefined1 (*) [32])(pauVar45[1] + lVar43 * 4) = auVar93;
                                      pauVar45 = pauVar45 + 2;
                                    }
                                    else if (iVar54 == 8) {
                                      *pauVar45 = auVar122;
                                      pauVar45[1] = auVar110;
                                      pauVar45[2] = auVar95;
                                      pauVar45[3] = auVar78;
                                      pauVar45 = pauVar45 + 4;
                                    }
                                  }
                                  pauVar52 = pauVar52 + 4;
                                  auVar98._4_4_ = uVar53 + 7;
                                  uVar53 = uVar53 + 4;
                                }
                                auVar98._4_4_ = uVar53 | 1;
                                while ((int)auVar98._4_4_ < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar21 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar81 = ZEXT3264(*pauVar21);
                                      auVar97 = ZEXT3264(*pauVar21);
                                    }
                                  }
                                  else {
                                    auVar97 = ZEXT3264(*pauVar52);
                                    auVar81 = ZEXT3264(pauVar52[1]);
                                  }
                                  auVar79 = auVar81._0_32_;
                                  auVar96 = auVar97._0_32_;
                                  if (0 < iVar33) {
                                    lVar35 = 0;
                                    uVar30 = uVar23;
                                    do {
                                      pfVar32 = pfVar42 + lVar35;
                                      fVar57 = *(float *)((long)pfVar44 + lVar35);
                                      auVar96._0_4_ = fVar57 * *pfVar32 + auVar97._0_4_;
                                      auVar96._4_4_ = fVar57 * pfVar32[1] + auVar97._4_4_;
                                      auVar96._8_4_ = fVar57 * pfVar32[2] + auVar97._8_4_;
                                      auVar96._12_4_ = fVar57 * pfVar32[3] + auVar97._12_4_;
                                      auVar96._16_4_ = fVar57 * pfVar32[4] + auVar97._16_4_;
                                      auVar96._20_4_ = fVar57 * pfVar32[5] + auVar97._20_4_;
                                      auVar96._24_4_ = fVar57 * pfVar32[6] + auVar97._24_4_;
                                      auVar96._28_4_ = fVar57 + auVar97._28_4_;
                                      auVar97 = ZEXT3264(auVar96);
                                      fVar57 = *(float *)((long)pfVar44 + lVar35 + 4);
                                      auVar79._0_4_ = fVar57 * *pfVar32 + auVar81._0_4_;
                                      auVar79._4_4_ = fVar57 * pfVar32[1] + auVar81._4_4_;
                                      auVar79._8_4_ = fVar57 * pfVar32[2] + auVar81._8_4_;
                                      auVar79._12_4_ = fVar57 * pfVar32[3] + auVar81._12_4_;
                                      auVar79._16_4_ = fVar57 * pfVar32[4] + auVar81._16_4_;
                                      auVar79._20_4_ = fVar57 * pfVar32[5] + auVar81._20_4_;
                                      auVar79._24_4_ = fVar57 * pfVar32[6] + auVar81._24_4_;
                                      auVar79._28_4_ = pfVar32[7] + auVar81._28_4_;
                                      auVar81 = ZEXT3264(auVar79);
                                      lVar35 = lVar35 + 8;
                                      auVar98._4_4_ = (int)uVar30 - 1;
                                      uVar30 = (ulong)auVar98._4_4_;
                                    } while (auVar98._4_4_ != 0);
                                    pfVar44 = (float *)((long)pfVar44 + lVar35);
                                  }
                                  if (iVar24 < iVar40) {
                                    *pauVar52 = auVar96;
                                    pauVar52[1] = auVar79;
                                  }
                                  else {
                                    auVar98 = auVar96._16_16_;
                                    auVar58 = auVar79._0_16_;
                                    auVar83 = auVar96._0_16_;
                                    if (iVar54 == 1) {
                                      *(int *)*pauVar45 = auVar96._0_4_;
                                      uVar25 = vextractps_avx(auVar83,1);
                                      *(undefined4 *)(*pauVar45 + lVar48 * 4) = uVar25;
                                      uVar25 = vextractps_avx(auVar83,2);
                                      *(undefined4 *)(*pauVar45 + lVar18 * 4) = uVar25;
                                      uVar25 = vextractps_avx(auVar83,3);
                                      *(undefined4 *)(*pauVar45 + local_138 * 4) = uVar25;
                                      *(int *)(*pauVar45 + lVar43 * 4) = auVar96._16_4_;
                                      uVar25 = vextractps_avx(auVar98,1);
                                      *(undefined4 *)(*pauVar45 + local_b0 * 4) = uVar25;
                                      uVar25 = vextractps_avx(auVar98,2);
                                      *(undefined4 *)(*pauVar45 + local_b8 * 4) = uVar25;
                                      uVar25 = vextractps_avx(auVar98,3);
                                      *(undefined4 *)(*pauVar45 + local_c0 * 4) = uVar25;
                                      *(int *)(*pauVar45 + 4) = auVar79._0_4_;
                                      uVar25 = vextractps_avx(auVar58,1);
                                      *(undefined4 *)(*pauVar45 + local_130 * 4) = uVar25;
                                      uVar25 = vextractps_avx(auVar58,2);
                                      *(undefined4 *)(*pauVar45 + (long)local_c8 * 4) = uVar25;
                                      uVar25 = vextractps_avx(auVar58,3);
                                      *(undefined4 *)(*pauVar45 + (long)local_d0 * 4) = uVar25;
                                      auVar58 = auVar79._16_16_;
                                      *(int *)(*pauVar45 + local_68 * 4) = auVar79._16_4_;
                                      uVar25 = vextractps_avx(auVar58,1);
                                      *(undefined4 *)(*pauVar45 + local_70 * 4) = uVar25;
                                      uVar25 = vextractps_avx(auVar58,2);
                                      *(undefined4 *)(*pauVar45 + local_78 * 4) = uVar25;
                                      uVar25 = vextractps_avx(auVar58,3);
                                      *(undefined4 *)(*pauVar45 + local_80 * 4) = uVar25;
                                      pauVar45 = (undefined1 (*) [32])(*pauVar45 + 8);
                                    }
                                    else if (iVar54 == 4) {
                                      auVar111._16_16_ = auVar58;
                                      auVar111._0_16_ = auVar83;
                                      auVar76 = vperm2f128_avx(auVar96,auVar79,0x31);
                                      *pauVar45 = auVar111;
                                      *(undefined1 (*) [32])(*pauVar45 + lVar43 * 4) = auVar76;
                                      pauVar45 = pauVar45 + 1;
                                    }
                                    else if (iVar54 == 8) {
                                      *pauVar45 = auVar96;
                                      pauVar45[1] = auVar79;
                                      pauVar45 = pauVar45 + 2;
                                    }
                                  }
                                  pauVar52 = pauVar52 + 2;
                                  auVar98._4_4_ = uVar53 + 3;
                                  uVar53 = uVar53 + 2;
                                }
                                if ((int)uVar53 < (int)uVar26) {
                                  do {
                                    if (iVar34 == 0) {
                                      if (pauVar21 == (undefined1 (*) [32])0x0) {
                                        auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                      }
                                      else {
                                        auVar81 = ZEXT3264(*pauVar21);
                                      }
                                    }
                                    else {
                                      auVar81 = ZEXT3264(*pauVar52);
                                    }
                                    auVar80 = auVar81._0_32_;
                                    if (0 < iVar33) {
                                      lVar35 = 0;
                                      uVar30 = uVar23;
                                      do {
                                        fVar57 = *(float *)((long)pfVar44 + lVar35);
                                        pfVar32 = pfVar42 + lVar35 * 2;
                                        auVar80._0_4_ = fVar57 * *pfVar32 + auVar81._0_4_;
                                        auVar80._4_4_ = fVar57 * pfVar32[1] + auVar81._4_4_;
                                        auVar80._8_4_ = fVar57 * pfVar32[2] + auVar81._8_4_;
                                        auVar80._12_4_ = fVar57 * pfVar32[3] + auVar81._12_4_;
                                        auVar80._16_4_ = fVar57 * pfVar32[4] + auVar81._16_4_;
                                        auVar80._20_4_ = fVar57 * pfVar32[5] + auVar81._20_4_;
                                        auVar80._24_4_ = fVar57 * pfVar32[6] + auVar81._24_4_;
                                        auVar80._28_4_ = fVar57 + auVar81._28_4_;
                                        auVar81 = ZEXT3264(auVar80);
                                        lVar35 = lVar35 + 4;
                                        auVar98._4_4_ = (int)uVar30 - 1;
                                        uVar30 = (ulong)auVar98._4_4_;
                                      } while (auVar98._4_4_ != 0);
                                      pfVar44 = (float *)((long)pfVar44 + lVar35);
                                    }
                                    if (iVar24 < iVar40) {
                                      *pauVar52 = auVar80;
                                    }
                                    else {
                                      auVar83 = auVar80._16_16_;
                                      auVar58 = auVar80._0_16_;
                                      if (iVar54 == 1) {
                                        *(int *)*pauVar45 = auVar80._0_4_;
                                        uVar25 = vextractps_avx(auVar58,1);
                                        *(undefined4 *)(*pauVar45 + lVar48 * 4) = uVar25;
                                        uVar25 = vextractps_avx(auVar58,2);
                                        *(undefined4 *)(*pauVar45 + lVar18 * 4) = uVar25;
                                        uVar25 = vextractps_avx(auVar58,3);
                                        *(undefined4 *)(*pauVar45 + lVar31 * 4) = uVar25;
                                        *(int *)(*pauVar45 + lVar43 * 4) = auVar80._16_4_;
                                        uVar25 = vextractps_avx(auVar83,1);
                                        *(undefined4 *)(*pauVar45 + lVar36 * 4) = uVar25;
                                        uVar25 = vextractps_avx(auVar83,2);
                                        *(undefined4 *)(*pauVar45 + local_1c8 * 4) = uVar25;
                                        uVar25 = vextractps_avx(auVar83,3);
                                        *(undefined4 *)(*pauVar45 + lVar47 * 4) = uVar25;
                                        pauVar45 = (undefined1 (*) [32])(*pauVar45 + 4);
                                      }
                                      else if (iVar54 == 4) {
                                        *(undefined1 (*) [16])*pauVar45 = auVar58;
                                        *(undefined1 (*) [16])(*pauVar45 + lVar43 * 4) = auVar83;
                                        pauVar45 = (undefined1 (*) [32])(*pauVar45 + 0x10);
                                      }
                                      else if (iVar54 == 8) {
                                        *pauVar45 = auVar80;
                                        pauVar45 = pauVar45 + 1;
                                      }
                                    }
                                    pauVar52 = pauVar52 + 1;
                                    uVar53 = uVar53 + 1;
                                  } while (uVar53 != uVar26);
                                }
                                pfVar42 = pfVar42 + iVar33 * 8;
                                uVar30 = local_38 + 8;
                                pauVar45 = pauVar21;
                                local_88 = uVar41;
                              } while (local_38 + 0xf < (ulong)uVar50);
                            }
                            if ((int)((uint)uVar30 | 3) < (int)uVar50) {
                              local_130 = (long)(iVar54 * iVar51);
                              lVar18 = (long)iVar29;
                              lVar31 = (long)(iVar29 * 2);
                              lVar36 = (long)(local_90 * 0x300000000) >> 0x20;
                              local_138 = (long)(iVar33 * 4) * 4;
                              uVar30 = uVar30 & 0xffffffff;
                              pauVar45 = pauVar21;
                              do {
                                local_1c8 = uVar30;
                                pauVar21 = (undefined1 (*) [32])
                                           ((long)(this->super_Convolution).bias_data.data +
                                           local_1c8 * 4 + local_190 * 4);
                                if (pauVar45 == (undefined1 (*) [32])0x0) {
                                  pauVar21 = pauVar45;
                                }
                                uVar53 = 0;
                                pauVar22 = (undefined1 (*) [16])
                                           ((long)local_1d0->data +
                                           local_130 * 4 + (local_1c8 + local_190) * lVar18 * 4);
                                pfVar44 = local_1d8;
                                if (0xb < (int)uVar26) {
                                  uVar15 = 0;
                                  do {
                                    if (iVar34 == 0) {
                                      if (pauVar21 == (undefined1 (*) [32])0x0) {
                                        auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar112 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar138 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar151 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar155 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar161 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar167 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar173 = ZEXT1664(ZEXT816(0) << 0x40);
                                      }
                                      else {
                                        auVar58 = *(undefined1 (*) [16])*pauVar21;
                                        auVar81 = ZEXT1664(auVar58);
                                        auVar97 = ZEXT1664(auVar58);
                                        auVar112 = ZEXT1664(auVar58);
                                        auVar123 = ZEXT1664(auVar58);
                                        auVar130 = ZEXT1664(auVar58);
                                        auVar138 = ZEXT1664(auVar58);
                                        auVar145 = ZEXT1664(auVar58);
                                        auVar151 = ZEXT1664(auVar58);
                                        auVar155 = ZEXT1664(auVar58);
                                        auVar161 = ZEXT1664(auVar58);
                                        auVar167 = ZEXT1664(auVar58);
                                        auVar173 = ZEXT1664(auVar58);
                                      }
                                    }
                                    else {
                                      auVar173 = ZEXT1664(*(undefined1 (*) [16])*pauVar52);
                                      auVar167 = ZEXT1664(*(undefined1 (*) [16])(*pauVar52 + 0x10));
                                      auVar161 = ZEXT1664(*(undefined1 (*) [16])pauVar52[1]);
                                      auVar155 = ZEXT1664(*(undefined1 (*) [16])(pauVar52[1] + 0x10)
                                                         );
                                      auVar151 = ZEXT1664(*(undefined1 (*) [16])pauVar52[2]);
                                      auVar145 = ZEXT1664(*(undefined1 (*) [16])(pauVar52[2] + 0x10)
                                                         );
                                      auVar138 = ZEXT1664(*(undefined1 (*) [16])pauVar52[3]);
                                      auVar130 = ZEXT1664(*(undefined1 (*) [16])(pauVar52[3] + 0x10)
                                                         );
                                      auVar123 = ZEXT1664(*(undefined1 (*) [16])pauVar52[4]);
                                      auVar112 = ZEXT1664(*(undefined1 (*) [16])(pauVar52[4] + 0x10)
                                                         );
                                      auVar97 = ZEXT1664(*(undefined1 (*) [16])pauVar52[5]);
                                      auVar81 = ZEXT1664(*(undefined1 (*) [16])(pauVar52[5] + 0x10))
                                      ;
                                    }
                                    auVar58 = auVar81._0_16_;
                                    auVar84 = auVar97._0_16_;
                                    auVar99 = auVar112._0_16_;
                                    auVar113 = auVar123._0_16_;
                                    auVar124 = auVar130._0_16_;
                                    auVar131 = auVar138._0_16_;
                                    auVar139 = auVar145._0_16_;
                                    auVar146 = auVar151._0_16_;
                                    auVar152 = auVar155._0_16_;
                                    auVar156 = auVar161._0_16_;
                                    auVar162 = auVar167._0_16_;
                                    auVar168 = auVar173._0_16_;
                                    uVar41 = uVar23;
                                    pfVar32 = pfVar42;
                                    if (0 < iVar33) {
                                      do {
                                        fVar2 = *pfVar32;
                                        fVar3 = pfVar32[1];
                                        fVar4 = pfVar32[2];
                                        fVar5 = pfVar32[3];
                                        fVar57 = *pfVar44;
                                        auVar168._0_4_ = fVar57 * fVar2 + auVar173._0_4_;
                                        auVar168._4_4_ = fVar57 * fVar3 + auVar173._4_4_;
                                        auVar168._8_4_ = fVar57 * fVar4 + auVar173._8_4_;
                                        auVar168._12_4_ = fVar57 * fVar5 + auVar173._12_4_;
                                        auVar173 = ZEXT1664(auVar168);
                                        fVar57 = pfVar44[1];
                                        auVar162._0_4_ = fVar57 * fVar2 + auVar167._0_4_;
                                        auVar162._4_4_ = fVar57 * fVar3 + auVar167._4_4_;
                                        auVar162._8_4_ = fVar57 * fVar4 + auVar167._8_4_;
                                        auVar162._12_4_ = fVar57 * fVar5 + auVar167._12_4_;
                                        auVar167 = ZEXT1664(auVar162);
                                        fVar57 = pfVar44[2];
                                        auVar156._0_4_ = fVar57 * fVar2 + auVar161._0_4_;
                                        auVar156._4_4_ = fVar57 * fVar3 + auVar161._4_4_;
                                        auVar156._8_4_ = fVar57 * fVar4 + auVar161._8_4_;
                                        auVar156._12_4_ = fVar57 * fVar5 + auVar161._12_4_;
                                        auVar161 = ZEXT1664(auVar156);
                                        fVar57 = pfVar44[3];
                                        auVar152._0_4_ = fVar57 * fVar2 + auVar155._0_4_;
                                        auVar152._4_4_ = fVar57 * fVar3 + auVar155._4_4_;
                                        auVar152._8_4_ = fVar57 * fVar4 + auVar155._8_4_;
                                        auVar152._12_4_ = fVar57 * fVar5 + auVar155._12_4_;
                                        auVar155 = ZEXT1664(auVar152);
                                        fVar57 = pfVar44[4];
                                        auVar146._0_4_ = fVar57 * fVar2 + auVar151._0_4_;
                                        auVar146._4_4_ = fVar57 * fVar3 + auVar151._4_4_;
                                        auVar146._8_4_ = fVar57 * fVar4 + auVar151._8_4_;
                                        auVar146._12_4_ = fVar57 * fVar5 + auVar151._12_4_;
                                        auVar151 = ZEXT1664(auVar146);
                                        fVar57 = pfVar44[5];
                                        auVar139._0_4_ = fVar57 * fVar2 + auVar145._0_4_;
                                        auVar139._4_4_ = fVar57 * fVar3 + auVar145._4_4_;
                                        auVar139._8_4_ = fVar57 * fVar4 + auVar145._8_4_;
                                        auVar139._12_4_ = fVar57 * fVar5 + auVar145._12_4_;
                                        auVar145 = ZEXT1664(auVar139);
                                        fVar57 = pfVar44[6];
                                        auVar131._0_4_ = fVar57 * fVar2 + auVar138._0_4_;
                                        auVar131._4_4_ = fVar57 * fVar3 + auVar138._4_4_;
                                        auVar131._8_4_ = fVar57 * fVar4 + auVar138._8_4_;
                                        auVar131._12_4_ = fVar57 * fVar5 + auVar138._12_4_;
                                        auVar138 = ZEXT1664(auVar131);
                                        fVar57 = pfVar44[7];
                                        auVar124._0_4_ = fVar57 * fVar2 + auVar130._0_4_;
                                        auVar124._4_4_ = fVar57 * fVar3 + auVar130._4_4_;
                                        auVar124._8_4_ = fVar57 * fVar4 + auVar130._8_4_;
                                        auVar124._12_4_ = fVar57 * fVar5 + auVar130._12_4_;
                                        auVar130 = ZEXT1664(auVar124);
                                        fVar57 = pfVar44[8];
                                        auVar113._0_4_ = fVar57 * fVar2 + auVar123._0_4_;
                                        auVar113._4_4_ = fVar57 * fVar3 + auVar123._4_4_;
                                        auVar113._8_4_ = fVar57 * fVar4 + auVar123._8_4_;
                                        auVar113._12_4_ = fVar57 * fVar5 + auVar123._12_4_;
                                        auVar123 = ZEXT1664(auVar113);
                                        fVar57 = pfVar44[9];
                                        auVar99._0_4_ = fVar57 * fVar2 + auVar112._0_4_;
                                        auVar99._4_4_ = fVar57 * fVar3 + auVar112._4_4_;
                                        auVar99._8_4_ = fVar57 * fVar4 + auVar112._8_4_;
                                        auVar99._12_4_ = fVar57 * fVar5 + auVar112._12_4_;
                                        auVar112 = ZEXT1664(auVar99);
                                        fVar57 = pfVar44[10];
                                        auVar84._0_4_ = fVar57 * fVar2 + auVar97._0_4_;
                                        auVar84._4_4_ = fVar57 * fVar3 + auVar97._4_4_;
                                        auVar84._8_4_ = fVar57 * fVar4 + auVar97._8_4_;
                                        auVar84._12_4_ = fVar57 * fVar5 + auVar97._12_4_;
                                        auVar97 = ZEXT1664(auVar84);
                                        fVar57 = pfVar44[0xb];
                                        auVar58._0_4_ = fVar57 * fVar2 + auVar81._0_4_;
                                        auVar58._4_4_ = fVar57 * fVar3 + auVar81._4_4_;
                                        auVar58._8_4_ = fVar57 * fVar4 + auVar81._8_4_;
                                        auVar58._12_4_ = fVar57 * fVar5 + auVar81._12_4_;
                                        auVar81 = ZEXT1664(auVar58);
                                        pfVar44 = pfVar44 + 0xc;
                                        auVar98._4_4_ = (int)uVar41 - 1;
                                        uVar41 = (ulong)auVar98._4_4_;
                                        pfVar32 = pfVar32 + 4;
                                      } while (auVar98._4_4_ != 0);
                                    }
                                    if (iVar24 < iVar40) {
                                      *(undefined1 (*) [16])*pauVar52 = auVar168;
                                      *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar162;
                                      *(undefined1 (*) [16])pauVar52[1] = auVar156;
                                      *(undefined1 (*) [16])(pauVar52[1] + 0x10) = auVar152;
                                      *(undefined1 (*) [16])pauVar52[2] = auVar146;
                                      *(undefined1 (*) [16])(pauVar52[2] + 0x10) = auVar139;
                                      *(undefined1 (*) [16])pauVar52[3] = auVar131;
                                      *(undefined1 (*) [16])(pauVar52[3] + 0x10) = auVar124;
                                      *(undefined1 (*) [16])pauVar52[4] = auVar113;
                                      *(undefined1 (*) [16])(pauVar52[4] + 0x10) = auVar99;
                                      *(undefined1 (*) [16])pauVar52[5] = auVar84;
                                      *(undefined1 (*) [16])(pauVar52[5] + 0x10) = auVar58;
                                    }
                                    else if (iVar54 == 1) {
                                      auVar98 = vunpcklps_avx(auVar168,auVar162);
                                      auVar59 = vunpcklps_avx(auVar156,auVar152);
                                      auVar82 = vunpckhps_avx(auVar168,auVar162);
                                      auVar156 = vunpckhps_avx(auVar156,auVar152);
                                      auVar83 = vmovlhps_avx(auVar98,auVar59);
                                      auVar152 = vunpckhpd_avx(auVar98,auVar59);
                                      auVar98 = vmovlhps_avx(auVar82,auVar156);
                                      auVar156 = vunpckhpd_avx(auVar82,auVar156);
                                      auVar162 = vunpcklps_avx(auVar146,auVar139);
                                      auVar168 = vunpcklps_avx(auVar131,auVar124);
                                      auVar139 = vunpckhps_avx(auVar146,auVar139);
                                      auVar146 = vunpckhps_avx(auVar131,auVar124);
                                      auVar82 = vmovlhps_avx(auVar162,auVar168);
                                      auVar131 = vunpckhpd_avx(auVar162,auVar168);
                                      auVar124 = vmovlhps_avx(auVar139,auVar146);
                                      auVar139 = vunpckhpd_avx(auVar139,auVar146);
                                      auVar162 = vunpcklps_avx(auVar113,auVar99);
                                      auVar168 = vunpcklps_avx(auVar84,auVar58);
                                      auVar113 = vunpckhps_avx(auVar113,auVar99);
                                      auVar146 = vunpckhps_avx(auVar84,auVar58);
                                      auVar58 = vmovlhps_avx(auVar162,auVar168);
                                      auVar99 = vunpckhpd_avx(auVar162,auVar168);
                                      auVar84 = vmovlhps_avx(auVar113,auVar146);
                                      auVar113 = vunpckhpd_avx(auVar113,auVar146);
                                      *pauVar22 = auVar83;
                                      *(undefined1 (*) [16])(*pauVar22 + lVar18 * 4) = auVar152;
                                      *(undefined1 (*) [16])(*pauVar22 + lVar31 * 4) = auVar98;
                                      *(undefined1 (*) [16])(*pauVar22 + lVar36 * 4) = auVar156;
                                      pauVar22[1] = auVar82;
                                      *(undefined1 (*) [16])(pauVar22[1] + lVar18 * 4) = auVar131;
                                      *(undefined1 (*) [16])(pauVar22[1] + lVar31 * 4) = auVar124;
                                      *(undefined1 (*) [16])(pauVar22[1] + lVar36 * 4) = auVar139;
                                      pauVar22[2] = auVar58;
                                      *(undefined1 (*) [16])(pauVar22[2] + lVar18 * 4) = auVar99;
                                      *(undefined1 (*) [16])(pauVar22[2] + lVar31 * 4) = auVar84;
                                      *(undefined1 (*) [16])(pauVar22[2] + lVar36 * 4) = auVar113;
                                      pauVar22 = pauVar22 + 3;
                                    }
                                    else if (iVar54 == 4) {
                                      *pauVar22 = auVar168;
                                      pauVar22[1] = auVar162;
                                      pauVar22[2] = auVar156;
                                      pauVar22[3] = auVar152;
                                      pauVar22[4] = auVar146;
                                      pauVar22[5] = auVar139;
                                      pauVar22[6] = auVar131;
                                      pauVar22[7] = auVar124;
                                      pauVar22[8] = auVar113;
                                      pauVar22[9] = auVar99;
                                      pauVar22[10] = auVar84;
                                      pauVar22[0xb] = auVar58;
                                      pauVar22 = pauVar22 + 0xc;
                                    }
                                    pauVar52 = pauVar52 + 6;
                                    uVar53 = uVar15 + 0xc;
                                    iVar16 = uVar15 + 0x17;
                                    uVar15 = uVar53;
                                  } while (iVar16 < (int)uVar26);
                                }
                                iVar16 = uVar53 + 7;
                                while (iVar16 < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar21 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar112 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar138 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar151 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar58 = *(undefined1 (*) [16])*pauVar21;
                                      auVar81 = ZEXT1664(auVar58);
                                      auVar97 = ZEXT1664(auVar58);
                                      auVar112 = ZEXT1664(auVar58);
                                      auVar123 = ZEXT1664(auVar58);
                                      auVar130 = ZEXT1664(auVar58);
                                      auVar138 = ZEXT1664(auVar58);
                                      auVar145 = ZEXT1664(auVar58);
                                      auVar151 = ZEXT1664(auVar58);
                                    }
                                  }
                                  else {
                                    auVar151 = ZEXT1664(*(undefined1 (*) [16])*pauVar52);
                                    auVar145 = ZEXT1664(*(undefined1 (*) [16])(*pauVar52 + 0x10));
                                    auVar138 = ZEXT1664(*(undefined1 (*) [16])pauVar52[1]);
                                    auVar130 = ZEXT1664(*(undefined1 (*) [16])(pauVar52[1] + 0x10));
                                    auVar81 = ZEXT1664(*(undefined1 (*) [16])pauVar52[2]);
                                    auVar97 = ZEXT1664(*(undefined1 (*) [16])(pauVar52[2] + 0x10));
                                    auVar112 = ZEXT1664(*(undefined1 (*) [16])pauVar52[3]);
                                    auVar123 = ZEXT1664(*(undefined1 (*) [16])(pauVar52[3] + 0x10));
                                  }
                                  auVar114 = auVar123._0_16_;
                                  auVar100 = auVar112._0_16_;
                                  auVar85 = auVar97._0_16_;
                                  auVar59 = auVar81._0_16_;
                                  auVar125 = auVar130._0_16_;
                                  auVar132 = auVar138._0_16_;
                                  auVar140 = auVar145._0_16_;
                                  auVar147 = auVar151._0_16_;
                                  uVar41 = uVar23;
                                  pfVar32 = pfVar42;
                                  if (0 < iVar33) {
                                    do {
                                      fVar2 = *pfVar32;
                                      fVar3 = pfVar32[1];
                                      fVar4 = pfVar32[2];
                                      fVar5 = pfVar32[3];
                                      fVar57 = *pfVar44;
                                      auVar147._0_4_ = fVar57 * fVar2 + auVar151._0_4_;
                                      auVar147._4_4_ = fVar57 * fVar3 + auVar151._4_4_;
                                      auVar147._8_4_ = fVar57 * fVar4 + auVar151._8_4_;
                                      auVar147._12_4_ = fVar57 * fVar5 + auVar151._12_4_;
                                      auVar151 = ZEXT1664(auVar147);
                                      fVar57 = pfVar44[1];
                                      auVar140._0_4_ = fVar57 * fVar2 + auVar145._0_4_;
                                      auVar140._4_4_ = fVar57 * fVar3 + auVar145._4_4_;
                                      auVar140._8_4_ = fVar57 * fVar4 + auVar145._8_4_;
                                      auVar140._12_4_ = fVar57 * fVar5 + auVar145._12_4_;
                                      auVar145 = ZEXT1664(auVar140);
                                      fVar57 = pfVar44[2];
                                      auVar132._0_4_ = fVar57 * fVar2 + auVar138._0_4_;
                                      auVar132._4_4_ = fVar57 * fVar3 + auVar138._4_4_;
                                      auVar132._8_4_ = fVar57 * fVar4 + auVar138._8_4_;
                                      auVar132._12_4_ = fVar57 * fVar5 + auVar138._12_4_;
                                      auVar138 = ZEXT1664(auVar132);
                                      fVar57 = pfVar44[3];
                                      auVar125._0_4_ = fVar57 * fVar2 + auVar130._0_4_;
                                      auVar125._4_4_ = fVar57 * fVar3 + auVar130._4_4_;
                                      auVar125._8_4_ = fVar57 * fVar4 + auVar130._8_4_;
                                      auVar125._12_4_ = fVar57 * fVar5 + auVar130._12_4_;
                                      auVar130 = ZEXT1664(auVar125);
                                      fVar57 = pfVar44[4];
                                      auVar59._0_4_ = fVar57 * fVar2 + auVar81._0_4_;
                                      auVar59._4_4_ = fVar57 * fVar3 + auVar81._4_4_;
                                      auVar59._8_4_ = fVar57 * fVar4 + auVar81._8_4_;
                                      auVar59._12_4_ = fVar57 * fVar5 + auVar81._12_4_;
                                      auVar81 = ZEXT1664(auVar59);
                                      fVar57 = pfVar44[5];
                                      auVar85._0_4_ = fVar57 * fVar2 + auVar97._0_4_;
                                      auVar85._4_4_ = fVar57 * fVar3 + auVar97._4_4_;
                                      auVar85._8_4_ = fVar57 * fVar4 + auVar97._8_4_;
                                      auVar85._12_4_ = fVar57 * fVar5 + auVar97._12_4_;
                                      auVar97 = ZEXT1664(auVar85);
                                      fVar57 = pfVar44[6];
                                      auVar100._0_4_ = fVar57 * fVar2 + auVar112._0_4_;
                                      auVar100._4_4_ = fVar57 * fVar3 + auVar112._4_4_;
                                      auVar100._8_4_ = fVar57 * fVar4 + auVar112._8_4_;
                                      auVar100._12_4_ = fVar57 * fVar5 + auVar112._12_4_;
                                      auVar112 = ZEXT1664(auVar100);
                                      fVar57 = pfVar44[7];
                                      auVar114._0_4_ = fVar57 * fVar2 + auVar123._0_4_;
                                      auVar114._4_4_ = fVar57 * fVar3 + auVar123._4_4_;
                                      auVar114._8_4_ = fVar57 * fVar4 + auVar123._8_4_;
                                      auVar114._12_4_ = fVar57 * fVar5 + auVar123._12_4_;
                                      auVar123 = ZEXT1664(auVar114);
                                      pfVar44 = pfVar44 + 8;
                                      auVar98._4_4_ = (int)uVar41 - 1;
                                      uVar41 = (ulong)auVar98._4_4_;
                                      pfVar32 = pfVar32 + 4;
                                    } while (auVar98._4_4_ != 0);
                                  }
                                  if (iVar24 < iVar40) {
                                    *(undefined1 (*) [16])*pauVar52 = auVar147;
                                    *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar140;
                                    *(undefined1 (*) [16])pauVar52[1] = auVar132;
                                    *(undefined1 (*) [16])(pauVar52[1] + 0x10) = auVar125;
                                    *(undefined1 (*) [16])pauVar52[2] = auVar59;
                                    *(undefined1 (*) [16])(pauVar52[2] + 0x10) = auVar85;
                                    *(undefined1 (*) [16])pauVar52[3] = auVar100;
                                    *(undefined1 (*) [16])(pauVar52[3] + 0x10) = auVar114;
                                  }
                                  else if (iVar54 == 1) {
                                    auVar83 = vunpcklps_avx(auVar147,auVar140);
                                    auVar84 = vunpcklps_avx(auVar132,auVar125);
                                    auVar98 = vunpckhps_avx(auVar147,auVar140);
                                    auVar82 = vunpckhps_avx(auVar132,auVar125);
                                    auVar58 = vmovlhps_avx(auVar83,auVar84);
                                    auVar84 = vunpckhpd_avx(auVar83,auVar84);
                                    auVar83 = vmovlhps_avx(auVar98,auVar82);
                                    auVar99 = vunpckhpd_avx(auVar98,auVar82);
                                    auVar82 = vunpcklps_avx(auVar59,auVar85);
                                    auVar113 = vunpcklps_avx(auVar100,auVar114);
                                    auVar124 = vunpckhps_avx(auVar59,auVar85);
                                    auVar131 = vunpckhps_avx(auVar100,auVar114);
                                    auVar98 = vmovlhps_avx(auVar82,auVar113);
                                    auVar113 = vunpckhpd_avx(auVar82,auVar113);
                                    auVar82 = vmovlhps_avx(auVar124,auVar131);
                                    auVar124 = vunpckhpd_avx(auVar124,auVar131);
                                    *pauVar22 = auVar58;
                                    *(undefined1 (*) [16])(*pauVar22 + lVar18 * 4) = auVar84;
                                    *(undefined1 (*) [16])(*pauVar22 + lVar31 * 4) = auVar83;
                                    *(undefined1 (*) [16])(*pauVar22 + lVar36 * 4) = auVar99;
                                    pauVar22[1] = auVar98;
                                    *(undefined1 (*) [16])(pauVar22[1] + lVar18 * 4) = auVar113;
                                    *(undefined1 (*) [16])(pauVar22[1] + lVar31 * 4) = auVar82;
                                    *(undefined1 (*) [16])(pauVar22[1] + lVar36 * 4) = auVar124;
                                    pauVar22 = pauVar22 + 2;
                                  }
                                  else if (iVar54 == 4) {
                                    *pauVar22 = auVar147;
                                    pauVar22[1] = auVar140;
                                    pauVar22[2] = auVar132;
                                    pauVar22[3] = auVar125;
                                    pauVar22[4] = auVar59;
                                    pauVar22[5] = auVar85;
                                    pauVar22[6] = auVar100;
                                    pauVar22[7] = auVar114;
                                    pauVar22 = pauVar22 + 8;
                                  }
                                  pauVar52 = pauVar52 + 4;
                                  iVar16 = uVar53 + 0xf;
                                  uVar53 = uVar53 + 8;
                                }
                                auVar98._4_4_ = uVar53 | 3;
                                while ((int)auVar98._4_4_ < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar21 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar112 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar58 = *(undefined1 (*) [16])*pauVar21;
                                      auVar81 = ZEXT1664(auVar58);
                                      auVar97 = ZEXT1664(auVar58);
                                      auVar112 = ZEXT1664(auVar58);
                                      auVar123 = ZEXT1664(auVar58);
                                    }
                                  }
                                  else {
                                    auVar81 = ZEXT1664(*(undefined1 (*) [16])*pauVar52);
                                    auVar97 = ZEXT1664(*(undefined1 (*) [16])(*pauVar52 + 0x10));
                                    auVar112 = ZEXT1664(*(undefined1 (*) [16])pauVar52[1]);
                                    auVar123 = ZEXT1664(*(undefined1 (*) [16])(pauVar52[1] + 0x10));
                                  }
                                  auVar115 = auVar123._0_16_;
                                  auVar101 = auVar112._0_16_;
                                  auVar86 = auVar97._0_16_;
                                  auVar60 = auVar81._0_16_;
                                  if (0 < iVar33) {
                                    lVar43 = 0;
                                    uVar41 = uVar23;
                                    do {
                                      pfVar32 = (float *)((long)pfVar42 + lVar43);
                                      fVar2 = *pfVar32;
                                      fVar3 = pfVar32[1];
                                      fVar4 = pfVar32[2];
                                      fVar5 = pfVar32[3];
                                      fVar57 = *(float *)((long)pfVar44 + lVar43);
                                      auVar60._0_4_ = fVar57 * fVar2 + auVar81._0_4_;
                                      auVar60._4_4_ = fVar57 * fVar3 + auVar81._4_4_;
                                      auVar60._8_4_ = fVar57 * fVar4 + auVar81._8_4_;
                                      auVar60._12_4_ = fVar57 * fVar5 + auVar81._12_4_;
                                      auVar81 = ZEXT1664(auVar60);
                                      fVar57 = *(float *)((long)pfVar44 + lVar43 + 4);
                                      auVar86._0_4_ = fVar57 * fVar2 + auVar97._0_4_;
                                      auVar86._4_4_ = fVar57 * fVar3 + auVar97._4_4_;
                                      auVar86._8_4_ = fVar57 * fVar4 + auVar97._8_4_;
                                      auVar86._12_4_ = fVar57 * fVar5 + auVar97._12_4_;
                                      auVar97 = ZEXT1664(auVar86);
                                      fVar57 = *(float *)((long)pfVar44 + lVar43 + 8);
                                      auVar101._0_4_ = fVar57 * fVar2 + auVar112._0_4_;
                                      auVar101._4_4_ = fVar57 * fVar3 + auVar112._4_4_;
                                      auVar101._8_4_ = fVar57 * fVar4 + auVar112._8_4_;
                                      auVar101._12_4_ = fVar57 * fVar5 + auVar112._12_4_;
                                      auVar112 = ZEXT1664(auVar101);
                                      fVar57 = *(float *)((long)pfVar44 + lVar43 + 0xc);
                                      auVar115._0_4_ = fVar57 * fVar2 + auVar123._0_4_;
                                      auVar115._4_4_ = fVar57 * fVar3 + auVar123._4_4_;
                                      auVar115._8_4_ = fVar57 * fVar4 + auVar123._8_4_;
                                      auVar115._12_4_ = fVar57 * fVar5 + auVar123._12_4_;
                                      auVar123 = ZEXT1664(auVar115);
                                      lVar43 = lVar43 + 0x10;
                                      auVar98._4_4_ = (int)uVar41 - 1;
                                      uVar41 = (ulong)auVar98._4_4_;
                                    } while (auVar98._4_4_ != 0);
                                    pfVar44 = (float *)((long)pfVar44 + lVar43);
                                  }
                                  if (iVar24 < iVar40) {
                                    *(undefined1 (*) [16])*pauVar52 = auVar60;
                                    *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar86;
                                    *(undefined1 (*) [16])pauVar52[1] = auVar101;
                                    *(undefined1 (*) [16])(pauVar52[1] + 0x10) = auVar115;
                                  }
                                  else if (iVar54 == 1) {
                                    auVar83 = vunpcklps_avx(auVar60,auVar86);
                                    auVar98 = vunpcklps_avx(auVar101,auVar115);
                                    auVar82 = vunpckhps_avx(auVar60,auVar86);
                                    auVar84 = vunpckhps_avx(auVar101,auVar115);
                                    auVar58 = vmovlhps_avx(auVar83,auVar98);
                                    auVar98 = vunpckhpd_avx(auVar83,auVar98);
                                    auVar83 = vmovlhps_avx(auVar82,auVar84);
                                    auVar82 = vunpckhpd_avx(auVar82,auVar84);
                                    *pauVar22 = auVar58;
                                    *(undefined1 (*) [16])(*pauVar22 + lVar18 * 4) = auVar98;
                                    *(undefined1 (*) [16])(*pauVar22 + lVar31 * 4) = auVar83;
                                    *(undefined1 (*) [16])(*pauVar22 + lVar36 * 4) = auVar82;
                                    pauVar22 = pauVar22 + 1;
                                  }
                                  else if (iVar54 == 4) {
                                    *pauVar22 = auVar60;
                                    pauVar22[1] = auVar86;
                                    pauVar22[2] = auVar101;
                                    pauVar22[3] = auVar115;
                                    pauVar22 = pauVar22 + 4;
                                  }
                                  pauVar52 = pauVar52 + 2;
                                  auVar98._4_4_ = uVar53 + 7;
                                  uVar53 = uVar53 + 4;
                                }
                                auVar98._4_4_ = uVar53 | 1;
                                while ((int)auVar98._4_4_ < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar21 == (undefined1 (*) [32])0x0) {
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar97 = ZEXT1664(*(undefined1 (*) [16])*pauVar21);
                                      auVar81 = ZEXT1664(*(undefined1 (*) [16])*pauVar21);
                                    }
                                  }
                                  else {
                                    auVar97 = ZEXT1664(*(undefined1 (*) [16])*pauVar52);
                                    auVar81 = ZEXT1664(*(undefined1 (*) [16])(*pauVar52 + 0x10));
                                  }
                                  auVar61 = auVar81._0_16_;
                                  auVar87 = auVar97._0_16_;
                                  if (0 < iVar33) {
                                    lVar43 = 0;
                                    uVar41 = uVar23;
                                    do {
                                      pfVar32 = (float *)((long)pfVar42 + lVar43 * 2);
                                      fVar57 = *(float *)((long)pfVar44 + lVar43);
                                      auVar87._0_4_ = fVar57 * *pfVar32 + auVar97._0_4_;
                                      auVar87._4_4_ = fVar57 * pfVar32[1] + auVar97._4_4_;
                                      auVar87._8_4_ = fVar57 * pfVar32[2] + auVar97._8_4_;
                                      auVar87._12_4_ = fVar57 * pfVar32[3] + auVar97._12_4_;
                                      auVar97 = ZEXT1664(auVar87);
                                      fVar57 = *(float *)((long)pfVar44 + lVar43 + 4);
                                      auVar61._0_4_ = fVar57 * *pfVar32 + auVar81._0_4_;
                                      auVar61._4_4_ = fVar57 * pfVar32[1] + auVar81._4_4_;
                                      auVar61._8_4_ = fVar57 * pfVar32[2] + auVar81._8_4_;
                                      auVar61._12_4_ = fVar57 * pfVar32[3] + auVar81._12_4_;
                                      auVar81 = ZEXT1664(auVar61);
                                      lVar43 = lVar43 + 8;
                                      auVar98._4_4_ = (int)uVar41 - 1;
                                      uVar41 = (ulong)auVar98._4_4_;
                                    } while (auVar98._4_4_ != 0);
                                    pfVar44 = (float *)((long)pfVar44 + lVar43);
                                  }
                                  if (iVar24 < iVar40) {
                                    *(undefined1 (*) [16])*pauVar52 = auVar87;
                                    *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar61;
                                  }
                                  else if (iVar54 == 1) {
                                    *(int *)*pauVar22 = auVar87._0_4_;
                                    uVar25 = vextractps_avx(auVar87,1);
                                    *(undefined4 *)(*pauVar22 + lVar18 * 4) = uVar25;
                                    uVar25 = vextractps_avx(auVar87,2);
                                    *(undefined4 *)(*pauVar22 + lVar31 * 4) = uVar25;
                                    uVar25 = vextractps_avx(auVar87,3);
                                    *(undefined4 *)(*pauVar22 + (long)(iVar29 * 3) * 4) = uVar25;
                                    *(int *)(*pauVar22 + 4) = auVar61._0_4_;
                                    uVar25 = vextractps_avx(auVar61,1);
                                    *(undefined4 *)
                                     (*pauVar22 +
                                     ((long)((local_90 << 0x20) + 0x100000000) >> 0x20) * 4) =
                                         uVar25;
                                    uVar25 = vextractps_avx(auVar61,2);
                                    *(undefined4 *)(*pauVar22 + (long)(iVar29 * 2 + 1) * 4) = uVar25
                                    ;
                                    uVar25 = vextractps_avx(auVar61,3);
                                    *(undefined4 *)(*pauVar22 + (long)(iVar29 * 3 + 1) * 4) = uVar25
                                    ;
                                    pauVar22 = (undefined1 (*) [16])(*pauVar22 + 8);
                                  }
                                  else if (iVar54 == 4) {
                                    *pauVar22 = auVar87;
                                    pauVar22[1] = auVar61;
                                    pauVar22 = pauVar22 + 2;
                                  }
                                  pauVar52 = pauVar52 + 1;
                                  auVar98._4_4_ = uVar53 + 3;
                                  uVar53 = uVar53 + 2;
                                }
                                if ((int)uVar53 < (int)uVar26) {
                                  do {
                                    if (iVar34 == 0) {
                                      if (pauVar21 == (undefined1 (*) [32])0x0) {
                                        auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                      }
                                      else {
                                        auVar81 = ZEXT1664(*(undefined1 (*) [16])*pauVar21);
                                      }
                                    }
                                    else {
                                      auVar81 = ZEXT1664(*(undefined1 (*) [16])*pauVar52);
                                    }
                                    auVar62 = auVar81._0_16_;
                                    if (0 < iVar33) {
                                      lVar43 = 0;
                                      uVar41 = uVar23;
                                      do {
                                        fVar57 = *(float *)((long)pfVar44 + lVar43);
                                        pfVar32 = pfVar42 + lVar43;
                                        auVar62._0_4_ = fVar57 * *pfVar32 + auVar81._0_4_;
                                        auVar62._4_4_ = fVar57 * pfVar32[1] + auVar81._4_4_;
                                        auVar62._8_4_ = fVar57 * pfVar32[2] + auVar81._8_4_;
                                        auVar62._12_4_ = fVar57 * pfVar32[3] + auVar81._12_4_;
                                        auVar81 = ZEXT1664(auVar62);
                                        lVar43 = lVar43 + 4;
                                        auVar98._4_4_ = (int)uVar41 - 1;
                                        uVar41 = (ulong)auVar98._4_4_;
                                      } while (auVar98._4_4_ != 0);
                                      pfVar44 = (float *)((long)pfVar44 + lVar43);
                                    }
                                    if (iVar24 < iVar40) {
                                      *(undefined1 (*) [16])*pauVar52 = auVar62;
                                    }
                                    else if (iVar54 == 1) {
                                      *(int *)*pauVar22 = auVar62._0_4_;
                                      uVar25 = vextractps_avx(auVar62,1);
                                      *(undefined4 *)(*pauVar22 + lVar18 * 4) = uVar25;
                                      uVar25 = vextractps_avx(auVar62,2);
                                      *(undefined4 *)(*pauVar22 + lVar31 * 4) = uVar25;
                                      uVar25 = vextractps_avx(auVar62,3);
                                      *(undefined4 *)(*pauVar22 + lVar36 * 4) = uVar25;
                                      pauVar22 = (undefined1 (*) [16])(*pauVar22 + 4);
                                    }
                                    else if (iVar54 == 4) {
                                      *pauVar22 = auVar62;
                                      pauVar22 = pauVar22 + 1;
                                    }
                                    pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
                                    uVar53 = uVar53 + 1;
                                  } while (uVar53 != uVar26);
                                }
                                pfVar42 = pfVar42 + iVar33 * 4;
                                uVar30 = local_1c8 + 4;
                                pauVar45 = pauVar21;
                              } while ((long)(local_1c8 + 7) < local_128);
                            }
                            if ((int)((uint)uVar30 | 1) < (int)uVar50) {
                              lVar36 = (long)iVar29;
                              uVar41 = uVar30 & 0xffffffff;
                              uVar53 = local_5c;
                              if ((int)uVar17 < (int)local_5c) {
                                uVar53 = uVar17;
                              }
                              do {
                                pauVar45 = (undefined1 (*) [32])
                                           ((long)(this->super_Convolution).bias_data.data +
                                           uVar41 * 4 + local_190 * 4);
                                if (pauVar21 != (undefined1 (*) [32])0x0) {
                                  pauVar21 = pauVar45;
                                }
                                uVar17 = 0;
                                pauVar22 = (undefined1 (*) [16])
                                           ((long)local_1d0->data +
                                           local_58 * 4 + (uVar41 + local_190) * lVar36 * 4);
                                pfVar44 = local_1d8;
                                if (0xb < (int)uVar26) {
                                  uVar15 = 0;
                                  do {
                                    if (iVar34 == 0) {
                                      if (pauVar21 == (undefined1 (*) [32])0x0) {
                                        auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar112 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar138 = ZEXT1664(ZEXT816(0) << 0x40);
                                      }
                                      else {
                                        uVar25 = *(undefined4 *)*pauVar21;
                                        auVar63._4_4_ = uVar25;
                                        auVar63._0_4_ = uVar25;
                                        auVar63._8_4_ = uVar25;
                                        auVar63._12_4_ = uVar25;
                                        auVar81 = ZEXT1664(auVar63);
                                        uVar25 = *(undefined4 *)(*pauVar21 + 4);
                                        auVar116._4_4_ = uVar25;
                                        auVar116._0_4_ = uVar25;
                                        auVar116._8_4_ = uVar25;
                                        auVar116._12_4_ = uVar25;
                                        auVar123 = ZEXT1664(auVar116);
                                        auVar97 = ZEXT1664(auVar63);
                                        auVar112 = ZEXT1664(auVar63);
                                        auVar130 = ZEXT1664(auVar116);
                                        auVar138 = ZEXT1664(auVar116);
                                      }
                                    }
                                    else {
                                      auVar58 = vshufps_avx(*(undefined1 (*) [16])*pauVar52,
                                                            *(undefined1 (*) [16])(*pauVar52 + 0x10)
                                                            ,0x88);
                                      auVar81 = ZEXT1664(auVar58);
                                      auVar58 = vshufps_avx(*(undefined1 (*) [16])pauVar52[1],
                                                            *(undefined1 (*) [16])
                                                             (pauVar52[1] + 0x10),0x88);
                                      auVar97 = ZEXT1664(auVar58);
                                      auVar58 = vshufps_avx(*(undefined1 (*) [16])pauVar52[2],
                                                            *(undefined1 (*) [16])
                                                             (pauVar52[2] + 0x10),0x88);
                                      auVar112 = ZEXT1664(auVar58);
                                      auVar58 = vshufps_avx(*(undefined1 (*) [16])*pauVar52,
                                                            *(undefined1 (*) [16])(*pauVar52 + 0x10)
                                                            ,0xdd);
                                      auVar123 = ZEXT1664(auVar58);
                                      auVar58 = vshufps_avx(*(undefined1 (*) [16])pauVar52[1],
                                                            *(undefined1 (*) [16])
                                                             (pauVar52[1] + 0x10),0xdd);
                                      auVar130 = ZEXT1664(auVar58);
                                      auVar58 = vshufps_avx(*(undefined1 (*) [16])pauVar52[2],
                                                            *(undefined1 (*) [16])
                                                             (pauVar52[2] + 0x10),0xdd);
                                      auVar138 = ZEXT1664(auVar58);
                                    }
                                    auVar133 = auVar138._0_16_;
                                    auVar102 = auVar112._0_16_;
                                    auVar126 = auVar130._0_16_;
                                    auVar88 = auVar97._0_16_;
                                    auVar117 = auVar123._0_16_;
                                    auVar64 = auVar81._0_16_;
                                    if (0 < iVar33) {
                                      lVar18 = 0;
                                      do {
                                        auVar58 = *(undefined1 (*) [16])(pfVar44 + 4);
                                        auVar83 = *(undefined1 (*) [16])(pfVar44 + 8);
                                        fVar57 = pfVar42[lVar18 * 2];
                                        auVar64._0_4_ = fVar57 * *pfVar44 + auVar81._0_4_;
                                        auVar64._4_4_ = fVar57 * pfVar44[1] + auVar81._4_4_;
                                        auVar64._8_4_ = fVar57 * pfVar44[2] + auVar81._8_4_;
                                        auVar64._12_4_ = fVar57 * pfVar44[3] + auVar81._12_4_;
                                        auVar81 = ZEXT1664(auVar64);
                                        auVar88._0_4_ = fVar57 * auVar58._0_4_ + auVar97._0_4_;
                                        auVar88._4_4_ = fVar57 * auVar58._4_4_ + auVar97._4_4_;
                                        auVar88._8_4_ = fVar57 * auVar58._8_4_ + auVar97._8_4_;
                                        auVar88._12_4_ = fVar57 * auVar58._12_4_ + auVar97._12_4_;
                                        auVar97 = ZEXT1664(auVar88);
                                        auVar102._0_4_ = fVar57 * auVar83._0_4_ + auVar112._0_4_;
                                        auVar102._4_4_ = fVar57 * auVar83._4_4_ + auVar112._4_4_;
                                        auVar102._8_4_ = fVar57 * auVar83._8_4_ + auVar112._8_4_;
                                        auVar102._12_4_ = fVar57 * auVar83._12_4_ + auVar112._12_4_;
                                        auVar112 = ZEXT1664(auVar102);
                                        fVar57 = pfVar42[lVar18 * 2 + 1];
                                        auVar117._0_4_ = fVar57 * *pfVar44 + auVar123._0_4_;
                                        auVar117._4_4_ = fVar57 * pfVar44[1] + auVar123._4_4_;
                                        auVar117._8_4_ = fVar57 * pfVar44[2] + auVar123._8_4_;
                                        auVar117._12_4_ = fVar57 * pfVar44[3] + auVar123._12_4_;
                                        auVar123 = ZEXT1664(auVar117);
                                        auVar126._0_4_ = fVar57 * auVar58._0_4_ + auVar130._0_4_;
                                        auVar126._4_4_ = fVar57 * auVar58._4_4_ + auVar130._4_4_;
                                        auVar126._8_4_ = fVar57 * auVar58._8_4_ + auVar130._8_4_;
                                        auVar126._12_4_ = fVar57 * auVar58._12_4_ + auVar130._12_4_;
                                        auVar130 = ZEXT1664(auVar126);
                                        auVar133._0_4_ = fVar57 * auVar83._0_4_ + auVar138._0_4_;
                                        auVar133._4_4_ = fVar57 * auVar83._4_4_ + auVar138._4_4_;
                                        auVar133._8_4_ = fVar57 * auVar83._8_4_ + auVar138._8_4_;
                                        auVar133._12_4_ = fVar57 * auVar83._12_4_ + auVar138._12_4_;
                                        auVar138 = ZEXT1664(auVar133);
                                        pfVar44 = pfVar44 + 0xc;
                                        lVar18 = lVar18 + 1;
                                      } while (uVar53 != (uint)lVar18);
                                    }
                                    if (iVar24 < iVar40) {
                                      auVar82 = vunpcklps_avx(auVar64,auVar117);
                                      auVar58 = vunpckhps_avx(auVar64,auVar117);
                                      auVar84 = vunpcklps_avx(auVar88,auVar126);
                                      auVar83 = vunpckhps_avx(auVar88,auVar126);
                                      auVar99 = vunpcklps_avx(auVar102,auVar133);
                                      auVar98 = vunpckhps_avx(auVar102,auVar133);
                                      *(undefined1 (*) [16])*pauVar52 = auVar82;
                                      *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar58;
                                      *(undefined1 (*) [16])pauVar52[1] = auVar84;
                                      *(undefined1 (*) [16])(pauVar52[1] + 0x10) = auVar83;
                                      *(undefined1 (*) [16])pauVar52[2] = auVar99;
                                      *(undefined1 (*) [16])(pauVar52[2] + 0x10) = auVar98;
                                    }
                                    else {
                                      *pauVar22 = auVar64;
                                      pauVar22[1] = auVar88;
                                      pauVar22[2] = auVar102;
                                      *(undefined1 (*) [16])(*pauVar22 + lVar36 * 4) = auVar117;
                                      *(undefined1 (*) [16])(pauVar22[1] + lVar36 * 4) = auVar126;
                                      *(undefined1 (*) [16])(pauVar22[2] + lVar36 * 4) = auVar133;
                                      pauVar22 = pauVar22 + 3;
                                    }
                                    pauVar52 = pauVar52 + 3;
                                    uVar17 = uVar15 + 0xc;
                                    iVar54 = uVar15 + 0x17;
                                    uVar15 = uVar17;
                                  } while (iVar54 < (int)uVar26);
                                }
                                iVar54 = uVar17 + 7;
                                while (iVar54 < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar21 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar112 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      uVar25 = *(undefined4 *)*pauVar21;
                                      auVar65._4_4_ = uVar25;
                                      auVar65._0_4_ = uVar25;
                                      auVar65._8_4_ = uVar25;
                                      auVar65._12_4_ = uVar25;
                                      auVar81 = ZEXT1664(auVar65);
                                      uVar25 = *(undefined4 *)(*pauVar21 + 4);
                                      auVar103._4_4_ = uVar25;
                                      auVar103._0_4_ = uVar25;
                                      auVar103._8_4_ = uVar25;
                                      auVar103._12_4_ = uVar25;
                                      auVar112 = ZEXT1664(auVar103);
                                      auVar97 = ZEXT1664(auVar65);
                                      auVar123 = ZEXT1664(auVar103);
                                    }
                                  }
                                  else {
                                    auVar58 = vshufps_avx(*(undefined1 (*) [16])*pauVar52,
                                                          *(undefined1 (*) [16])(*pauVar52 + 0x10),
                                                          0x88);
                                    auVar81 = ZEXT1664(auVar58);
                                    auVar58 = vshufps_avx(*(undefined1 (*) [16])pauVar52[1],
                                                          *(undefined1 (*) [16])(pauVar52[1] + 0x10)
                                                          ,0x88);
                                    auVar97 = ZEXT1664(auVar58);
                                    auVar58 = vshufps_avx(*(undefined1 (*) [16])*pauVar52,
                                                          *(undefined1 (*) [16])(*pauVar52 + 0x10),
                                                          0xdd);
                                    auVar112 = ZEXT1664(auVar58);
                                    auVar58 = vshufps_avx(*(undefined1 (*) [16])pauVar52[1],
                                                          *(undefined1 (*) [16])(pauVar52[1] + 0x10)
                                                          ,0xdd);
                                    auVar123 = ZEXT1664(auVar58);
                                  }
                                  auVar118 = auVar123._0_16_;
                                  auVar89 = auVar97._0_16_;
                                  auVar104 = auVar112._0_16_;
                                  auVar66 = auVar81._0_16_;
                                  if (0 < iVar33) {
                                    lVar18 = 0;
                                    do {
                                      auVar58 = *(undefined1 (*) [16])(pfVar44 + 4);
                                      fVar57 = pfVar42[lVar18 * 2];
                                      auVar66._0_4_ = fVar57 * *pfVar44 + auVar81._0_4_;
                                      auVar66._4_4_ = fVar57 * pfVar44[1] + auVar81._4_4_;
                                      auVar66._8_4_ = fVar57 * pfVar44[2] + auVar81._8_4_;
                                      auVar66._12_4_ = fVar57 * pfVar44[3] + auVar81._12_4_;
                                      auVar81 = ZEXT1664(auVar66);
                                      auVar89._0_4_ = fVar57 * auVar58._0_4_ + auVar97._0_4_;
                                      auVar89._4_4_ = fVar57 * auVar58._4_4_ + auVar97._4_4_;
                                      auVar89._8_4_ = fVar57 * auVar58._8_4_ + auVar97._8_4_;
                                      auVar89._12_4_ = fVar57 * auVar58._12_4_ + auVar97._12_4_;
                                      auVar97 = ZEXT1664(auVar89);
                                      fVar57 = pfVar42[lVar18 * 2 + 1];
                                      auVar104._0_4_ = fVar57 * *pfVar44 + auVar112._0_4_;
                                      auVar104._4_4_ = fVar57 * pfVar44[1] + auVar112._4_4_;
                                      auVar104._8_4_ = fVar57 * pfVar44[2] + auVar112._8_4_;
                                      auVar104._12_4_ = fVar57 * pfVar44[3] + auVar112._12_4_;
                                      auVar112 = ZEXT1664(auVar104);
                                      auVar118._0_4_ = fVar57 * auVar58._0_4_ + auVar123._0_4_;
                                      auVar118._4_4_ = fVar57 * auVar58._4_4_ + auVar123._4_4_;
                                      auVar118._8_4_ = fVar57 * auVar58._8_4_ + auVar123._8_4_;
                                      auVar118._12_4_ = fVar57 * auVar58._12_4_ + auVar123._12_4_;
                                      auVar123 = ZEXT1664(auVar118);
                                      pfVar44 = pfVar44 + 8;
                                      lVar18 = lVar18 + 1;
                                    } while (uVar53 != (uint)lVar18);
                                  }
                                  if (iVar24 < iVar40) {
                                    auVar98 = vunpcklps_avx(auVar66,auVar104);
                                    auVar58 = vunpckhps_avx(auVar66,auVar104);
                                    auVar82 = vunpcklps_avx(auVar89,auVar118);
                                    auVar83 = vunpckhps_avx(auVar89,auVar118);
                                    *(undefined1 (*) [16])*pauVar52 = auVar98;
                                    *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar58;
                                    *(undefined1 (*) [16])pauVar52[1] = auVar82;
                                    *(undefined1 (*) [16])(pauVar52[1] + 0x10) = auVar83;
                                  }
                                  else {
                                    *pauVar22 = auVar66;
                                    pauVar22[1] = auVar89;
                                    *(undefined1 (*) [16])(*pauVar22 + lVar36 * 4) = auVar104;
                                    *(undefined1 (*) [16])(pauVar22[1] + lVar36 * 4) = auVar118;
                                    pauVar22 = pauVar22 + 2;
                                  }
                                  pauVar52 = pauVar52 + 2;
                                  iVar54 = uVar17 + 0xf;
                                  uVar17 = uVar17 + 8;
                                }
                                auVar98._4_4_ = uVar17 | 3;
                                while ((int)auVar98._4_4_ < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar21 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      uVar25 = *(undefined4 *)*pauVar21;
                                      auVar81 = ZEXT1664(CONCAT412(uVar25,CONCAT48(uVar25,CONCAT44(
                                                  uVar25,uVar25))));
                                      uVar25 = *(undefined4 *)(*pauVar21 + 4);
                                      auVar97 = ZEXT1664(CONCAT412(uVar25,CONCAT48(uVar25,CONCAT44(
                                                  uVar25,uVar25))));
                                    }
                                  }
                                  else {
                                    auVar58 = vshufps_avx(*(undefined1 (*) [16])*pauVar52,
                                                          *(undefined1 (*) [16])(*pauVar52 + 0x10),
                                                          0x88);
                                    auVar81 = ZEXT1664(auVar58);
                                    auVar58 = vshufps_avx(*(undefined1 (*) [16])*pauVar52,
                                                          *(undefined1 (*) [16])(*pauVar52 + 0x10),
                                                          0xdd);
                                    auVar97 = ZEXT1664(auVar58);
                                  }
                                  auVar90 = auVar97._0_16_;
                                  auVar67 = auVar81._0_16_;
                                  if (0 < iVar33) {
                                    lVar18 = 0;
                                    do {
                                      fVar57 = pfVar42[lVar18 * 2];
                                      auVar67._0_4_ = fVar57 * *pfVar44 + auVar81._0_4_;
                                      auVar67._4_4_ = fVar57 * pfVar44[1] + auVar81._4_4_;
                                      auVar67._8_4_ = fVar57 * pfVar44[2] + auVar81._8_4_;
                                      auVar67._12_4_ = fVar57 * pfVar44[3] + auVar81._12_4_;
                                      auVar81 = ZEXT1664(auVar67);
                                      fVar57 = pfVar42[lVar18 * 2 + 1];
                                      auVar90._0_4_ = fVar57 * *pfVar44 + auVar97._0_4_;
                                      auVar90._4_4_ = fVar57 * pfVar44[1] + auVar97._4_4_;
                                      auVar90._8_4_ = fVar57 * pfVar44[2] + auVar97._8_4_;
                                      auVar90._12_4_ = fVar57 * pfVar44[3] + auVar97._12_4_;
                                      auVar97 = ZEXT1664(auVar90);
                                      pfVar44 = pfVar44 + 4;
                                      lVar18 = lVar18 + 1;
                                    } while (uVar53 != (uint)lVar18);
                                  }
                                  if (iVar24 < iVar40) {
                                    auVar83 = vunpcklps_avx(auVar67,auVar90);
                                    auVar58 = vunpckhps_avx(auVar67,auVar90);
                                    *(undefined1 (*) [16])*pauVar52 = auVar83;
                                    *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar58;
                                  }
                                  else {
                                    *pauVar22 = auVar67;
                                    *(undefined1 (*) [16])(*pauVar22 + lVar36 * 4) = auVar90;
                                    pauVar22 = pauVar22 + 1;
                                  }
                                  pauVar52 = pauVar52 + 1;
                                  auVar98._4_4_ = uVar17 + 7;
                                  uVar17 = uVar17 + 4;
                                }
                                auVar98._4_4_ = uVar17 | 1;
                                while ((int)auVar98._4_4_ < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar21 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar81 = ZEXT1664(CONCAT88(*(undefined8 *)*pauVar21,
                                                                  *(undefined8 *)*pauVar21));
                                    }
                                  }
                                  else {
                                    auVar81 = ZEXT1664(*(undefined1 (*) [16])*pauVar52);
                                  }
                                  auVar68 = auVar81._0_16_;
                                  if (0 < iVar33) {
                                    lVar18 = 0;
                                    lVar31 = 0;
                                    do {
                                      auVar105._8_8_ = 0;
                                      auVar105._0_8_ = *(ulong *)(pfVar44 + lVar31 * 2);
                                      auVar58 = vshufps_avx(auVar105,auVar105,0x50);
                                      fVar57 = (float)*(undefined8 *)(pfVar42 + lVar31 * 2);
                                      fVar2 = (float)((ulong)*(undefined8 *)(pfVar42 + lVar31 * 2)
                                                     >> 0x20);
                                      auVar68._0_4_ = auVar58._0_4_ * fVar57 + auVar81._0_4_;
                                      auVar68._4_4_ = auVar58._4_4_ * fVar2 + auVar81._4_4_;
                                      auVar68._8_4_ = auVar58._8_4_ * fVar57 + auVar81._8_4_;
                                      auVar68._12_4_ = auVar58._12_4_ * fVar2 + auVar81._12_4_;
                                      auVar81 = ZEXT1664(auVar68);
                                      lVar31 = lVar31 + 1;
                                      lVar18 = lVar18 + -8;
                                    } while (uVar53 != (uint)lVar31);
                                    pfVar44 = (float *)((long)pfVar44 - lVar18);
                                  }
                                  if (iVar24 < iVar40) {
                                    *(undefined1 (*) [16])*pauVar52 = auVar68;
                                  }
                                  else {
                                    auVar58 = vshufps_avx(auVar68,auVar68,0xe8);
                                    uVar1 = vmovlps_avx(auVar58);
                                    *(undefined8 *)*pauVar22 = uVar1;
                                    uVar25 = vextractps_avx(auVar68,1);
                                    *(undefined4 *)(*pauVar22 + lVar36 * 4) = uVar25;
                                    uVar25 = vextractps_avx(auVar68,3);
                                    *(undefined4 *)
                                     (*pauVar22 +
                                     ((long)((local_90 << 0x20) + 0x100000000) >> 0x20) * 4) =
                                         uVar25;
                                    pauVar22 = (undefined1 (*) [16])(*pauVar22 + 8);
                                  }
                                  pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
                                  auVar98._4_4_ = uVar17 + 3;
                                  uVar17 = uVar17 + 2;
                                }
                                if ((int)uVar17 < (int)uVar26) {
                                  do {
                                    auVar69 = ZEXT816(0) << 0x40;
                                    if (pauVar21 != (undefined1 (*) [32])0x0 || iVar34 != 0) {
                                      pauVar56 = pauVar45;
                                      if (iVar34 != 0) {
                                        pauVar56 = pauVar52;
                                      }
                                      auVar69._8_8_ = 0;
                                      auVar69._0_8_ = *(ulong *)*pauVar56;
                                    }
                                    if (0 < iVar33) {
                                      lVar18 = 0;
                                      auVar58 = auVar69;
                                      do {
                                        fVar57 = *pfVar44;
                                        auVar69._0_4_ =
                                             (float)*(undefined8 *)(pfVar42 + lVar18 * 2) * fVar57 +
                                             auVar58._0_4_;
                                        auVar69._4_4_ =
                                             (float)((ulong)*(undefined8 *)(pfVar42 + lVar18 * 2) >>
                                                    0x20) * fVar57 + auVar58._4_4_;
                                        auVar69._8_4_ = fVar57 * 0.0 + auVar58._8_4_;
                                        auVar69._12_4_ = fVar57 * 0.0 + auVar58._12_4_;
                                        pfVar44 = pfVar44 + 1;
                                        lVar18 = lVar18 + 1;
                                        auVar58 = auVar69;
                                      } while (uVar53 != (uint)lVar18);
                                    }
                                    if (iVar24 < iVar40) {
                                      uVar1 = vmovlps_avx(auVar69);
                                      *(undefined8 *)*pauVar52 = uVar1;
                                    }
                                    else {
                                      *(int *)*pauVar22 = auVar69._0_4_;
                                      uVar25 = vextractps_avx(auVar69,1);
                                      *(undefined4 *)(*pauVar22 + lVar36 * 4) = uVar25;
                                      pauVar22 = (undefined1 (*) [16])(*pauVar22 + 4);
                                    }
                                    pauVar52 = (undefined1 (*) [32])(*pauVar52 + 8);
                                    uVar17 = uVar17 + 1;
                                  } while (uVar17 != uVar26);
                                }
                                pfVar42 = pfVar42 + iVar33 * 2;
                                uVar30 = uVar41 + 2;
                                lVar18 = uVar41 + 3;
                                uVar41 = uVar30;
                              } while (lVar18 < local_128);
                            }
                            if ((int)uVar30 < (int)uVar50) {
                              lVar36 = (long)(int)uVar30;
                              do {
                                pauVar45 = (undefined1 (*) [32])
                                           ((long)(this->super_Convolution).bias_data.data +
                                           lVar36 * 4 + local_190 * 4);
                                if (pauVar21 == (undefined1 (*) [32])0x0) {
                                  pauVar45 = pauVar21;
                                }
                                auVar98._4_4_ = 0;
                                pauVar22 = (undefined1 (*) [16])
                                           ((long)local_1d0->data +
                                           local_58 * 4 + (lVar36 + local_190) * (long)iVar29 * 4);
                                pfVar44 = local_1d8;
                                if (0xb < (int)uVar26) {
                                  auVar98._12_4_ = 0;
                                  do {
                                    if (iVar34 == 0) {
                                      if (pauVar45 == (undefined1 (*) [32])0x0) {
                                        auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar112 = ZEXT1664(ZEXT816(0) << 0x40);
                                      }
                                      else {
                                        uVar25 = *(undefined4 *)*pauVar45;
                                        auVar70._4_4_ = uVar25;
                                        auVar70._0_4_ = uVar25;
                                        auVar70._8_4_ = uVar25;
                                        auVar70._12_4_ = uVar25;
                                        auVar81 = ZEXT1664(auVar70);
                                        auVar97 = ZEXT1664(auVar70);
                                        auVar112 = ZEXT1664(auVar70);
                                      }
                                    }
                                    else {
                                      auVar81 = ZEXT1664(*(undefined1 (*) [16])*pauVar52);
                                      auVar97 = ZEXT1664(*(undefined1 (*) [16])(*pauVar52 + 0x10));
                                      auVar112 = ZEXT1664(*(undefined1 (*) [16])pauVar52[1]);
                                    }
                                    auVar106 = auVar112._0_16_;
                                    auVar91 = auVar97._0_16_;
                                    auVar71 = auVar81._0_16_;
                                    if (0 < iVar33) {
                                      lVar18 = 0;
                                      do {
                                        fVar57 = pfVar42[lVar18];
                                        auVar71._0_4_ = fVar57 * *pfVar44 + auVar81._0_4_;
                                        auVar71._4_4_ = fVar57 * pfVar44[1] + auVar81._4_4_;
                                        auVar71._8_4_ = fVar57 * pfVar44[2] + auVar81._8_4_;
                                        auVar71._12_4_ = fVar57 * pfVar44[3] + auVar81._12_4_;
                                        auVar81 = ZEXT1664(auVar71);
                                        auVar91._0_4_ = fVar57 * pfVar44[4] + auVar97._0_4_;
                                        auVar91._4_4_ = fVar57 * pfVar44[5] + auVar97._4_4_;
                                        auVar91._8_4_ = fVar57 * pfVar44[6] + auVar97._8_4_;
                                        auVar91._12_4_ = fVar57 * pfVar44[7] + auVar97._12_4_;
                                        auVar97 = ZEXT1664(auVar91);
                                        auVar106._0_4_ = fVar57 * pfVar44[8] + auVar112._0_4_;
                                        auVar106._4_4_ = fVar57 * pfVar44[9] + auVar112._4_4_;
                                        auVar106._8_4_ = fVar57 * pfVar44[10] + auVar112._8_4_;
                                        auVar106._12_4_ = fVar57 * pfVar44[0xb] + auVar112._12_4_;
                                        auVar112 = ZEXT1664(auVar106);
                                        pfVar44 = pfVar44 + 0xc;
                                        lVar18 = lVar18 + 1;
                                      } while (iVar33 != (int)lVar18);
                                    }
                                    if (iVar24 < iVar40) {
                                      *(undefined1 (*) [16])*pauVar52 = auVar71;
                                      *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar91;
                                      *(undefined1 (*) [16])pauVar52[1] = auVar106;
                                    }
                                    else {
                                      *pauVar22 = auVar71;
                                      pauVar22[1] = auVar91;
                                      pauVar22[2] = auVar106;
                                      pauVar22 = pauVar22 + 3;
                                    }
                                    pauVar52 = (undefined1 (*) [32])(pauVar52[1] + 0x10);
                                    auVar98._4_4_ = auVar98._12_4_ + 0xc;
                                    iVar54 = auVar98._12_4_ + 0x17;
                                    auVar98._12_4_ = auVar98._4_4_;
                                  } while (iVar54 < (int)uVar26);
                                }
                                iVar54 = auVar98._4_4_ + 7;
                                while (iVar54 < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar45 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      uVar25 = *(undefined4 *)*pauVar45;
                                      auVar72._4_4_ = uVar25;
                                      auVar72._0_4_ = uVar25;
                                      auVar72._8_4_ = uVar25;
                                      auVar72._12_4_ = uVar25;
                                      auVar81 = ZEXT1664(auVar72);
                                      auVar97 = ZEXT1664(auVar72);
                                    }
                                  }
                                  else {
                                    auVar81 = ZEXT1664(*(undefined1 (*) [16])*pauVar52);
                                    auVar97 = ZEXT1664(*(undefined1 (*) [16])(*pauVar52 + 0x10));
                                  }
                                  auVar92 = auVar97._0_16_;
                                  auVar73 = auVar81._0_16_;
                                  if (0 < iVar33) {
                                    lVar18 = 0;
                                    do {
                                      fVar57 = pfVar42[lVar18];
                                      auVar73._0_4_ = fVar57 * *pfVar44 + auVar81._0_4_;
                                      auVar73._4_4_ = fVar57 * pfVar44[1] + auVar81._4_4_;
                                      auVar73._8_4_ = fVar57 * pfVar44[2] + auVar81._8_4_;
                                      auVar73._12_4_ = fVar57 * pfVar44[3] + auVar81._12_4_;
                                      auVar81 = ZEXT1664(auVar73);
                                      auVar92._0_4_ = fVar57 * pfVar44[4] + auVar97._0_4_;
                                      auVar92._4_4_ = fVar57 * pfVar44[5] + auVar97._4_4_;
                                      auVar92._8_4_ = fVar57 * pfVar44[6] + auVar97._8_4_;
                                      auVar92._12_4_ = fVar57 * pfVar44[7] + auVar97._12_4_;
                                      auVar97 = ZEXT1664(auVar92);
                                      pfVar44 = pfVar44 + 8;
                                      lVar18 = lVar18 + 1;
                                    } while (iVar33 != (int)lVar18);
                                  }
                                  if (iVar24 < iVar40) {
                                    *(undefined1 (*) [16])*pauVar52 = auVar73;
                                    *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar92;
                                  }
                                  else {
                                    *pauVar22 = auVar73;
                                    pauVar22[1] = auVar92;
                                    pauVar22 = pauVar22 + 2;
                                  }
                                  pauVar52 = pauVar52 + 1;
                                  iVar54 = auVar98._4_4_ + 0xf;
                                  auVar98._4_4_ = auVar98._4_4_ + 8;
                                }
                                auVar98._12_4_ = auVar98._4_4_ | 3;
                                while ((int)auVar98._12_4_ < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar45 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      uVar25 = *(undefined4 *)*pauVar45;
                                      auVar81 = ZEXT1664(CONCAT412(uVar25,CONCAT48(uVar25,CONCAT44(
                                                  uVar25,uVar25))));
                                    }
                                  }
                                  else {
                                    auVar81 = ZEXT1664(*(undefined1 (*) [16])*pauVar52);
                                  }
                                  auVar74 = auVar81._0_16_;
                                  if (0 < iVar33) {
                                    lVar18 = 0;
                                    do {
                                      fVar57 = pfVar42[lVar18];
                                      auVar74._0_4_ = fVar57 * *pfVar44 + auVar81._0_4_;
                                      auVar74._4_4_ = fVar57 * pfVar44[1] + auVar81._4_4_;
                                      auVar74._8_4_ = fVar57 * pfVar44[2] + auVar81._8_4_;
                                      auVar74._12_4_ = fVar57 * pfVar44[3] + auVar81._12_4_;
                                      auVar81 = ZEXT1664(auVar74);
                                      pfVar44 = pfVar44 + 4;
                                      lVar18 = lVar18 + 1;
                                    } while (iVar33 != (int)lVar18);
                                  }
                                  if (iVar24 < iVar40) {
                                    *(undefined1 (*) [16])*pauVar52 = auVar74;
                                  }
                                  else {
                                    *pauVar22 = auVar74;
                                    pauVar22 = pauVar22 + 1;
                                  }
                                  pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
                                  auVar98._12_4_ = auVar98._4_4_ + 7;
                                  auVar98._4_4_ = auVar98._4_4_ + 4;
                                }
                                auVar98._12_4_ = auVar98._4_4_ | 1;
                                while ((int)auVar98._12_4_ < (int)uVar26) {
                                  if (iVar34 == 0) {
                                    if (pauVar45 == (undefined1 (*) [32])0x0) {
                                      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      uVar25 = *(undefined4 *)*pauVar45;
                                      auVar81 = ZEXT1664(CONCAT412(uVar25,CONCAT48(uVar25,CONCAT44(
                                                  uVar25,uVar25))));
                                    }
                                  }
                                  else {
                                    auVar81 = ZEXT864(*(ulong *)*pauVar52);
                                  }
                                  auVar75 = auVar81._0_16_;
                                  if (0 < iVar33) {
                                    lVar18 = 0;
                                    lVar31 = 0;
                                    do {
                                      fVar57 = pfVar42[lVar31];
                                      auVar75._0_4_ =
                                           (float)*(undefined8 *)(pfVar44 + lVar31 * 2) * fVar57 +
                                           auVar81._0_4_;
                                      auVar75._4_4_ =
                                           (float)((ulong)*(undefined8 *)(pfVar44 + lVar31 * 2) >>
                                                  0x20) * fVar57 + auVar81._4_4_;
                                      auVar75._8_4_ = fVar57 * 0.0 + auVar81._8_4_;
                                      auVar75._12_4_ = fVar57 * 0.0 + auVar81._12_4_;
                                      auVar81 = ZEXT1664(auVar75);
                                      lVar31 = lVar31 + 1;
                                      lVar18 = lVar18 + -8;
                                    } while (iVar33 != (int)lVar31);
                                    pfVar44 = (float *)((long)pfVar44 - lVar18);
                                  }
                                  if (iVar24 < iVar40) {
                                    uVar1 = vmovlps_avx(auVar75);
                                    *(undefined8 *)*pauVar52 = uVar1;
                                  }
                                  else {
                                    uVar1 = vmovlps_avx(auVar75);
                                    *(undefined8 *)*pauVar22 = uVar1;
                                    pauVar22 = (undefined1 (*) [16])(*pauVar22 + 8);
                                  }
                                  pauVar52 = (undefined1 (*) [32])(*pauVar52 + 8);
                                  auVar98._12_4_ = auVar98._4_4_ + 3;
                                  auVar98._4_4_ = auVar98._4_4_ + 2;
                                }
                                if ((int)auVar98._4_4_ < (int)uVar26) {
                                  do {
                                    auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                                    if (pauVar45 != (undefined1 (*) [32])0x0 || iVar34 != 0) {
                                      pauVar21 = pauVar45;
                                      if (iVar34 != 0) {
                                        pauVar21 = pauVar52;
                                      }
                                      auVar81 = ZEXT464(*(uint *)*pauVar21);
                                    }
                                    fVar57 = auVar81._0_4_;
                                    if (0 < iVar33) {
                                      lVar18 = 0;
                                      do {
                                        fVar57 = *pfVar44 * pfVar42[lVar18] + auVar81._0_4_;
                                        auVar81 = ZEXT464((uint)fVar57);
                                        pfVar44 = pfVar44 + 1;
                                        lVar18 = lVar18 + 1;
                                      } while (iVar33 != (int)lVar18);
                                    }
                                    if (iVar24 < iVar40) {
                                      *(float *)*pauVar52 = fVar57;
                                    }
                                    else {
                                      *(float *)*pauVar22 = fVar57;
                                      pauVar22 = (undefined1 (*) [16])(*pauVar22 + 4);
                                    }
                                    pauVar52 = (undefined1 (*) [32])(*pauVar52 + 4);
                                    auVar98._4_4_ = auVar98._4_4_ + 1;
                                  } while (auVar98._4_4_ != uVar26);
                                }
                                lVar36 = lVar36 + 1;
                                pfVar42 = pfVar42 + iVar33;
                                pauVar21 = pauVar45;
                              } while (lVar36 != local_128);
                            }
                            local_1b0 = (ulong)(uint)TILE_K;
                            uVar41 = (ulong)(uint)(iVar34 + TILE_K);
                            pMVar28 = local_1d0;
                            uVar17 = TILE_N;
                            local_1a4 = iVar51;
                          } while (iVar34 + TILE_K < iVar40);
                        }
                        iVar51 = iVar51 + uVar17;
                        local_1bc = uVar50;
                        local_60 = iVar49;
                        local_50 = (ulong)uVar50;
                      } while (iVar51 < iVar14);
                    }
                    auVar98._4_4_ = (int)local_a8 + 1;
                    local_a8 = (ulong)auVar98._4_4_;
                    uVar23 = local_198;
                  } while (auVar98._4_4_ != local_120);
                }
                iVar14 = 0;
              }
              piVar20 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (local_118.allocator == (Allocator *)0x0) {
                    if (local_118.data != (void *)0x0) {
                      free(local_118.data);
                    }
                  }
                  else {
                    (*(local_118.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar20 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if (local_188.allocator == (Allocator *)0x0) {
                  if (local_188.data != (void *)0x0) {
                    free(local_188.data);
                  }
                }
                else {
                  (*(local_188.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (iVar14 == 0) {
              pLVar37 = this->activation;
              iVar14 = 0;
              if (pLVar37 != (Layer *)0x0) {
                (*pLVar37->_vptr_Layer[9])(pLVar37,pMVar28,opt);
              }
            }
          }
        }
      }
    }
LAB_00200ec3:
    piVar20 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar20 == (int *)0x0) {
      return iVar14;
    }
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 != 0) {
      return iVar14;
    }
    if (local_228.allocator != (Allocator *)0x0) {
      (*(local_228.allocator)->_vptr_Allocator[3])();
      return iVar14;
    }
    local_228.allocator = (Allocator *)0x0;
    __ptr = local_228.data;
    goto joined_r0x00200f5e;
  }
  local_188.cstep = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize = 0;
  local_188.elempack = 0;
  local_188.allocator = (Allocator *)0x0;
  local_188.dims = 0;
  local_188.w = 0;
  local_188.h = 0;
  local_188.d = 0;
  local_188.c = 0;
  if ((bottom_blob->elemsize & 0xf) == 0) {
    if (&local_188 == bottom_blob) {
      local_188.c = bottom_blob->w;
    }
    else {
      piVar20 = bottom_blob->refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      local_188.data = bottom_blob->data;
      local_188.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
      local_188.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
      local_188.elemsize = bottom_blob->elemsize;
      local_188.elempack = bottom_blob->elempack;
      local_188.allocator = bottom_blob->allocator;
      local_188.c = bottom_blob->w;
      local_188.d = bottom_blob->d;
    }
    local_188.dims = 3;
    local_188.w = 1;
    local_188.h = 1;
    local_188.cstep = 1;
LAB_002049cc:
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_1_ = 0;
    local_118.elemsize._1_7_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    iVar14 = (*(this->super_Convolution).super_Layer._vptr_Layer[7])(this,&local_188,&local_118,opt)
    ;
    if (iVar14 == 0) {
      if (((byte)local_118.elemsize & 0xf) == 0) {
        if (&local_118 != top_blob) {
          piVar20 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
          }
          piVar20 = top_blob->refcount;
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_118.data;
          top_blob->refcount = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
          top_blob->elemsize = CONCAT71(local_118.elemsize._1_7_,(byte)local_118.elemsize);
          top_blob->elempack = local_118.elempack;
          top_blob->allocator = local_118.allocator;
          top_blob->dims = local_118.dims;
          top_blob->w = local_118.w;
          top_blob->h = local_118.h;
          top_blob->d = local_118.d;
          top_blob->c = local_118.c;
          top_blob->cstep = local_118.cstep;
        }
        top_blob->dims = 1;
        top_blob->w = local_118.c;
        top_blob->h = 1;
        top_blob->c = 1;
        local_188.cstep = (size_t)local_118.c;
      }
      else {
        Mat::reshape(&local_228,&local_118,local_118.c,opt->blob_allocator);
        piVar20 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        if (&local_228 != top_blob) {
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
          }
          piVar20 = top_blob->refcount;
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          piVar20 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
          top_blob->data = local_228.data;
          top_blob->refcount = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
          top_blob->elemsize = local_228.elemsize;
          top_blob->elempack = local_228.elempack;
          top_blob->allocator = local_228.allocator;
          top_blob->dims = local_228.dims;
          top_blob->w = local_228.w;
          top_blob->h = local_228.h;
          top_blob->d = local_228.d;
          top_blob->c = local_228.c;
          top_blob->cstep = local_228.cstep;
        }
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar14 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_00204c61;
      }
      iVar14 = 0;
    }
LAB_00204c61:
    piVar20 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    Mat::reshape(&local_118,bottom_blob,1,1,bottom_blob->w,opt->workspace_allocator);
    piVar20 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + 1;
      UNLOCK();
    }
    piVar20 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
          if (local_188.data != (void *)0x0) {
            free(local_188.data);
          }
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar20 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    local_188.data = local_118.data;
    local_188.refcount._0_4_ = local_118.refcount._0_4_;
    local_188.refcount._4_4_ = local_118.refcount._4_4_;
    local_188.elemsize = CONCAT71(local_118.elemsize._1_7_,(byte)local_118.elemsize);
    local_188.elempack = local_118.elempack;
    local_188.allocator = local_118.allocator;
    local_188.dims = local_118.dims;
    local_188.w = local_118.w;
    local_188.h = local_118.h;
    local_188.d = local_118.d;
    local_188.c = local_118.c;
    local_188.cstep = local_118.cstep;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar14 = -100;
    if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0))
    goto LAB_002049cc;
  }
  piVar20 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar20 == (int *)0x0) {
    return iVar14;
  }
  LOCK();
  *piVar20 = *piVar20 + -1;
  UNLOCK();
  if (*piVar20 != 0) {
    return iVar14;
  }
  if (local_188.allocator != (Allocator *)0x0) {
    (*(local_188.allocator)->_vptr_Allocator[3])();
    return iVar14;
  }
  local_188.allocator = (Allocator *)0x0;
  __ptr = local_188.data;
joined_r0x00200f5e:
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar14;
}

Assistant:

int Convolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}